

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  Allocator *pAVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  __m256 afVar22;
  int iVar23;
  int iVar24;
  Mat *pMVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  long lVar29;
  Option *pOVar30;
  undefined1 (*pauVar31) [32];
  float *pfVar32;
  Mat *this_00;
  __m256 *pafVar33;
  undefined1 (*pauVar34) [16];
  void *pvVar35;
  undefined8 *puVar36;
  Mat *pMVar37;
  undefined1 (*pauVar38) [32];
  float *pfVar39;
  int iVar40;
  Mat *a;
  ulong uVar41;
  int y;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 (*pauVar45) [32];
  __m256 *pafVar46;
  long lVar47;
  __m256 *pafVar48;
  __m256 *pafVar49;
  undefined1 (*pauVar50) [16];
  undefined1 (*pauVar51) [16];
  long lVar52;
  void *pvVar53;
  uint uVar54;
  void *pvVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined8 uVar92;
  undefined1 auVar91 [56];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined8 uVar89;
  undefined8 uVar93;
  undefined1 auVar79 [64];
  undefined8 uVar90;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  float in_register_0000125c;
  __m128 afVar94;
  binary_op_pow op;
  __m256 _p1;
  __m256 _a0;
  __m256 *local_128;
  binary_op_pow local_119;
  Option *local_118;
  __m256 *local_110;
  undefined8 local_108;
  __m256 *local_100;
  Mat *local_f8;
  ulong local_f0;
  Mat *local_e8;
  Mat *local_e0;
  ulong local_d8;
  ulong local_d0;
  size_t local_c8;
  __m256 local_c0;
  __m256 local_a0;
  int local_64;
  size_t local_60;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar25 = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar23 = a->elempack;
  iVar24 = a[1].elempack;
  local_118 = opt;
  if (iVar24 != 8 && iVar23 != 8) {
switchD_0040cf7c_default:
    if (iVar24 != 4 && iVar23 != 4) {
switchD_0040d05b_default:
      iVar23 = BinaryOp::forward((BinaryOp *)
                                 ((long)&this->_vptr_BinaryOp_x86_avx +
                                 (long)this->_vptr_BinaryOp_x86_avx[-3]),bottom_blobs,top_blobs,opt)
      ;
      return iVar23;
    }
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3])) {
    case 0:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      uVar54 = a->w;
      uVar43 = a->h;
      iVar3 = a->d;
      uVar42 = a->c;
      uVar26 = (ulong)uVar42;
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
      sVar27 = a->elemsize;
      uVar44 = a[1].w;
      uVar4 = a[1].h;
      iVar5 = a[1].d;
      uVar6 = a[1].c;
      uVar28 = (ulong)uVar6;
      iVar40 = uVar4 * uVar44 * iVar5;
      sVar7 = a[1].elemsize;
      local_108 = sVar27;
      switch(a->dims) {
      case 1:
        local_e8 = pMVar25;
        if (iVar23 == 1 && uVar54 == 1) {
LAB_0040d0fc:
          local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
          iVar23 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                             (a,pMVar25,this_00,opt);
          return iVar23;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((uint)local_110 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                      (a,pMVar25,this_00,local_118);
            return 0;
          }
          goto LAB_00418026;
        case 2:
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pfVar32 = (float *)this_00->data;
          if (pfVar32 != (float *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar4) {
              pauVar34 = (undefined1 (*) [16])a->data;
              pfVar39 = (float *)a[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar60 = *pauVar34;
                  uVar43 = uVar44;
                  do {
                    fVar2 = pfVar39[1];
                    fVar16 = pfVar39[2];
                    fVar17 = pfVar39[3];
                    *pfVar32 = auVar60._0_4_ + *pfVar39;
                    pfVar32[1] = auVar60._4_4_ + fVar2;
                    pfVar32[2] = auVar60._8_4_ + fVar16;
                    pfVar32[3] = auVar60._12_4_ + fVar17;
                    pfVar39 = pfVar39 + 4;
                    pfVar32 = pfVar32 + 4;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          break;
        case 3:
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26);
                    *pfVar39 = auVar60._0_4_ + *pfVar32;
                    pfVar39[1] = auVar60._4_4_ + fVar2;
                    pfVar39[2] = auVar60._8_4_ + fVar16;
                    pfVar39[3] = auVar60._12_4_ + fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26);
                    *pfVar39 = auVar60._0_4_ + *pfVar32;
                    pfVar39[1] = auVar60._4_4_ + fVar2;
                    pfVar39[2] = auVar60._8_4_ + fVar16;
                    pfVar39[3] = auVar60._12_4_ + fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          break;
        default:
LAB_0041ac6d:
          return 0;
        }
        return -100;
      case 2:
        pAVar8 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar4) {
                  pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(a[1].cstep * uVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)a->w * uVar26 * a->elemsize + (long)a->data);
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *pauVar34;
                      uVar43 = uVar44;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ + *pfVar39;
                        pfVar32[1] = auVar60._4_4_ + fVar2;
                        pfVar32[2] = auVar60._8_4_ + fVar16;
                        pfVar32[3] = auVar60._12_4_ + fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar5) {
                  pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                                     (long)local_f8[1].data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)local_f8->w * uVar26 * local_f8->elemsize + (long)local_f8->data
                             );
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      auVar60 = *pauVar34;
                      uVar54 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            *pfVar32 = auVar60._0_4_ + *pfVar39;
                            pfVar32[1] = auVar60._4_4_ + fVar2;
                            pfVar32[2] = auVar60._8_4_ + fVar16;
                            pfVar32[3] = auVar60._12_4_ + fVar17;
                            pfVar39 = pfVar39 + 4;
                            pfVar32 = pfVar32 + 4;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar24 = local_f8[1].dims;
        if (iVar24 == 1) {
          Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
          pfVar32 = (float *)this_00->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar43) {
              pfVar39 = (float *)local_f8->data;
              pauVar34 = (undefined1 (*) [16])local_f8[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar60 = *pauVar34;
                  uVar44 = uVar54;
                  do {
                    fVar2 = pfVar39[1];
                    fVar16 = pfVar39[2];
                    fVar17 = pfVar39[3];
                    *pfVar32 = auVar60._0_4_ + *pfVar39;
                    pfVar32[1] = auVar60._4_4_ + fVar2;
                    pfVar32[2] = auVar60._8_4_ + fVar16;
                    pfVar32[3] = auVar60._12_4_ + fVar17;
                    pfVar39 = pfVar39 + 4;
                    pfVar32 = pfVar32 + 4;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
LAB_00418026:
          iVar23 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                             (a,pMVar25,this_00,local_118);
          return iVar23;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_f8 = a;
            local_e8 = pMVar25;
            Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar6) {
                uVar26 = 0;
                do {
                  if (0 < iVar5) {
                    pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                       (long)this_00->data);
                    pfVar39 = (float *)(local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                                       (long)local_f8[1].data);
                    pauVar34 = (undefined1 (*) [16])
                               (local_f8->cstep * uVar26 * local_f8->elemsize + (long)local_f8->data
                               );
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar4) {
                        uVar54 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar60 = *pauVar34;
                            uVar43 = uVar44;
                            do {
                              fVar2 = pfVar39[1];
                              fVar16 = pfVar39[2];
                              fVar17 = pfVar39[3];
                              *pfVar32 = auVar60._0_4_ + *pfVar39;
                              pfVar32[1] = auVar60._4_4_ + fVar2;
                              pfVar32[2] = auVar60._8_4_ + fVar16;
                              pfVar32[3] = auVar60._12_4_ + fVar17;
                              pfVar39 = pfVar39 + 4;
                              pfVar32 = pfVar32 + 4;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar54 = uVar54 + 1;
                        } while (uVar54 != uVar4);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar5);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar28);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_f8[1].dims != 1) {
            if (local_f8[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  pfVar32 = (float *)(this_00->cstep * uVar28 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)local_f8[1].w * uVar28 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pfVar39 = (float *)(local_f8->cstep * uVar28 * local_f8->elemsize +
                                     (long)local_f8->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *pauVar34;
                      uVar44 = uVar54;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ + *pfVar39;
                        pfVar32[1] = auVar60._4_4_ + fVar2;
                        pfVar32[2] = auVar60._8_4_ + fVar16;
                        pfVar32[3] = auVar60._12_4_ + fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)pMVar25->data + uVar28 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8->cstep;
                  sVar11 = local_f8->elemsize;
                  pvVar35 = local_f8->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                    *pfVar39 = auVar60._0_4_ + *pfVar32;
                    pfVar39[1] = auVar60._4_4_ + fVar2;
                    pfVar39[2] = auVar60._8_4_ + fVar16;
                    pfVar39[3] = auVar60._12_4_ + fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          goto LAB_00418026;
        }
        if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])
                             ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                  pvVar53 = this_00->data;
                  sVar10 = a->cstep;
                  sVar11 = a->elemsize;
                  pvVar35 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                    *pfVar39 = auVar60._0_4_ + *pfVar32;
                    pfVar39[1] = auVar60._4_4_ + fVar2;
                    pfVar39[2] = auVar60._8_4_ + fVar16;
                    pfVar39[3] = auVar60._12_4_ + fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar53 = this_00->data;
                  pvVar35 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar55 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    fVar2 = *(float *)((long)pvVar35 + lVar29);
                    pfVar32 = (float *)((long)pvVar55 + lVar29 * 4 + sVar10 * sVar11 * uVar28);
                    auVar58._0_4_ = fVar2 + *pfVar32;
                    auVar58._4_4_ = fVar2 + pfVar32[1];
                    auVar58._8_4_ = fVar2 + pfVar32[2];
                    auVar58._12_4_ = fVar2 + pfVar32[3];
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 * 4 + sVar27 * sVar7 * uVar28) =
                         auVar58;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_100 = (__m256 *)sVar7;
        if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar26 * a->elemsize);
                  pvVar53 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26);
                    *pfVar39 = auVar60._0_4_ + *pfVar32;
                    pfVar39[1] = auVar60._4_4_ + fVar2;
                    pfVar39[2] = auVar60._8_4_ + fVar16;
                    pfVar39[3] = auVar60._12_4_ + fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar44 == uVar54) && (iVar23 == 1)) && ((uVar4 == uVar43 && (uVar42 == 1)))) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pvVar53 = a->data;
                  pvVar35 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    fVar2 = *(float *)((long)pvVar53 + lVar29);
                    pfVar32 = (float *)((long)pvVar55 + lVar29 * 4 + sVar10 * sVar11 * uVar26);
                    auVar63._0_4_ = fVar2 + *pfVar32;
                    auVar63._4_4_ = fVar2 + pfVar32[1];
                    auVar63._8_4_ = fVar2 + pfVar32[2];
                    auVar63._12_4_ = fVar2 + pfVar32[3];
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 * 4 + sVar27 * sVar7 * uVar26) =
                         auVar63;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  pvVar53 = a[1].data;
                  pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(a->cstep * uVar26 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar41 * 0x10 + sVar27 * uVar26 * sVar7);
                      uVar42 = uVar54;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ + *pfVar39;
                        pfVar32[1] = auVar60._4_4_ + fVar2;
                        pfVar32[2] = auVar60._8_4_ + fVar16;
                        pfVar32[3] = auVar60._12_4_ + fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f0 = uVar28;
        if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_f0) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = local_f8[1].elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8->cstep * uVar28 * local_f8->elemsize +
                                    (long)local_f8->data);
                  sVar7 = local_f8[1].cstep;
                  pvVar53 = local_f8[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar29 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                        pfVar39 = (float *)((long)pvVar55 + lVar29);
                        auVar66._0_4_ = *pfVar32 + *pfVar39;
                        auVar66._4_4_ = pfVar32[1] + pfVar39[1];
                        auVar66._8_4_ = pfVar32[2] + pfVar39[2];
                        auVar66._12_4_ = pfVar32[3] + pfVar39[3];
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar66;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_f0) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->cstep;
                  sVar7 = local_f8->elemsize;
                  pvVar53 = local_f8->data;
                  pfVar32 = (float *)(this_00->cstep * uVar28 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                                     (long)local_f8[1].data);
                  uVar26 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar26 * 0x10 + sVar27 * uVar28 * sVar7);
                      uVar54 = uVar44;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ + *pfVar39;
                        pfVar32[1] = auVar60._4_4_ + fVar2;
                        pfVar32[2] = auVar60._8_4_ + fVar16;
                        pfVar32[3] = auVar60._12_4_ + fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_e8 = pMVar25;
        local_e0 = this_00;
        if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_f0) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                                    (long)local_f8[1].data);
                  sVar7 = local_f8->cstep;
                  pvVar53 = local_f8->data;
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar29 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar55 + lVar29);
                        pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                        auVar68._0_4_ = *pfVar32 + *pfVar39;
                        auVar68._4_4_ = pfVar32[1] + pfVar39[1];
                        auVar68._8_4_ = pfVar32[2] + pfVar39[2];
                        auVar68._12_4_ = pfVar32[3] + pfVar39[3];
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar68;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar44 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0041acd9;
      case 4:
        local_e8 = pMVar25;
        if (a[1].dims != 4) {
          local_f0 = uVar26;
          Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar23 = a[1].dims;
          if (iVar23 != 1) {
            if (iVar23 == 3) {
              if (0 < (int)local_f0) {
                sVar27 = 0;
                do {
                  if (0 < iVar3) {
                    pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                       (long)this_00->data);
                    pauVar34 = (undefined1 (*) [16])
                               (a[1].cstep * sVar27 * a[1].elemsize + (long)a[1].data);
                    pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            auVar60 = *pauVar34;
                            uVar44 = uVar54;
                            do {
                              fVar2 = pfVar39[1];
                              fVar16 = pfVar39[2];
                              fVar17 = pfVar39[3];
                              *pfVar32 = auVar60._0_4_ + *pfVar39;
                              pfVar32[1] = auVar60._4_4_ + fVar2;
                              pfVar32[2] = auVar60._8_4_ + fVar16;
                              pfVar32[3] = auVar60._12_4_ + fVar17;
                              pfVar39 = pfVar39 + 4;
                              pfVar32 = pfVar32 + 4;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar3);
                  }
                  sVar27 = sVar27 + 1;
                } while (sVar27 != local_f0);
                return 0;
              }
              return 0;
            }
            if (iVar23 != 2) {
              return 0;
            }
            if (0 < (int)local_f0) {
              sVar27 = 0;
              do {
                if (0 < iVar3) {
                  pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)a[1].w * sVar27 * a[1].elemsize + (long)a[1].data);
                  pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar60 = *pauVar34;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar54;
                        if (0 < (int)uVar54) {
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            *pfVar32 = auVar60._0_4_ + *pfVar39;
                            pfVar32[1] = auVar60._4_4_ + fVar2;
                            pfVar32[2] = auVar60._8_4_ + fVar16;
                            pfVar32[3] = auVar60._12_4_ + fVar17;
                            pfVar39 = pfVar39 + 4;
                            pfVar32 = pfVar32 + 4;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_f0);
              return 0;
            }
            return 0;
          }
          pMVar25 = local_e8;
          if ((uint)local_110 != 1 || a[1].w != 1) {
            if (0 < (int)local_f0) {
              sVar27 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar7 = a->cstep;
                  sVar10 = a->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_e8->data + sVar27 * 0x10);
                  pvVar53 = a->data;
                  sVar11 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27);
                    *pfVar39 = auVar60._0_4_ + *pfVar32;
                    pfVar39[1] = auVar60._4_4_ + fVar2;
                    pfVar39[2] = auVar60._8_4_ + fVar16;
                    pfVar39[3] = auVar60._12_4_ + fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_f0);
              return 0;
            }
            return 0;
          }
          goto LAB_00418026;
        }
        goto LAB_0040eb34;
      }
      goto LAB_004126a5;
    case 1:
      pMVar37 = pMVar25;
      break;
    case 2:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      uVar54 = a->w;
      uVar43 = a->h;
      iVar3 = a->d;
      uVar42 = a->c;
      uVar26 = (ulong)uVar42;
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
      sVar27 = a->elemsize;
      uVar44 = a[1].w;
      uVar4 = a[1].h;
      iVar5 = a[1].d;
      uVar6 = a[1].c;
      uVar28 = (ulong)uVar6;
      iVar40 = uVar4 * uVar44 * iVar5;
      sVar7 = a[1].elemsize;
      local_108 = sVar27;
      switch(a->dims) {
      case 1:
        local_e8 = pMVar25;
        if (iVar23 == 1 && uVar54 == 1) {
LAB_0040d5d4:
          local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
          iVar23 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
                             (a,pMVar25,this_00,opt);
          return iVar23;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((uint)local_110 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
                      (a,pMVar25,this_00,local_118);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pfVar32 = (float *)this_00->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar34 = (undefined1 (*) [16])a->data;
              pfVar39 = (float *)a[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar60 = *pauVar34;
                  uVar43 = uVar44;
                  do {
                    fVar2 = pfVar39[1];
                    fVar16 = pfVar39[2];
                    fVar17 = pfVar39[3];
                    *pfVar32 = auVar60._0_4_ * *pfVar39;
                    pfVar32[1] = auVar60._4_4_ * fVar2;
                    pfVar32[2] = auVar60._8_4_ * fVar16;
                    pfVar32[3] = auVar60._12_4_ * fVar17;
                    pfVar39 = pfVar39 + 4;
                    pfVar32 = pfVar32 + 4;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26);
                    *pfVar39 = auVar60._0_4_ * *pfVar32;
                    pfVar39[1] = auVar60._4_4_ * fVar2;
                    pfVar39[2] = auVar60._8_4_ * fVar16;
                    pfVar39[3] = auVar60._12_4_ * fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26);
                    *pfVar39 = auVar60._0_4_ * *pfVar32;
                    pfVar39[1] = auVar60._4_4_ * fVar2;
                    pfVar39[2] = auVar60._8_4_ * fVar16;
                    pfVar39[3] = auVar60._12_4_ * fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          goto LAB_0041ac6d;
        }
LAB_00417f23:
        iVar23 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
                           (a,pMVar25,this_00,local_118);
        return iVar23;
      case 2:
        pAVar8 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar4) {
                  pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(a[1].cstep * uVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)a->w * uVar26 * a->elemsize + (long)a->data);
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *pauVar34;
                      uVar43 = uVar44;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ * *pfVar39;
                        pfVar32[1] = auVar60._4_4_ * fVar2;
                        pfVar32[2] = auVar60._8_4_ * fVar16;
                        pfVar32[3] = auVar60._12_4_ * fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar5) {
                  pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                                     (long)local_f8[1].data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)local_f8->w * uVar26 * local_f8->elemsize + (long)local_f8->data
                             );
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      auVar60 = *pauVar34;
                      uVar54 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            *pfVar32 = auVar60._0_4_ * *pfVar39;
                            pfVar32[1] = auVar60._4_4_ * fVar2;
                            pfVar32[2] = auVar60._8_4_ * fVar16;
                            pfVar32[3] = auVar60._12_4_ * fVar17;
                            pfVar39 = pfVar39 + 4;
                            pfVar32 = pfVar32 + 4;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar24 = local_f8[1].dims;
        if (iVar24 == 1) {
          Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
          pfVar32 = (float *)this_00->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar43) {
              pfVar39 = (float *)local_f8->data;
              pauVar34 = (undefined1 (*) [16])local_f8[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar60 = *pauVar34;
                  uVar44 = uVar54;
                  do {
                    fVar2 = pfVar39[1];
                    fVar16 = pfVar39[2];
                    fVar17 = pfVar39[3];
                    *pfVar32 = auVar60._0_4_ * *pfVar39;
                    pfVar32[1] = auVar60._4_4_ * fVar2;
                    pfVar32[2] = auVar60._8_4_ * fVar16;
                    pfVar32[3] = auVar60._12_4_ * fVar17;
                    pfVar39 = pfVar39 + 4;
                    pfVar32 = pfVar32 + 4;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar34 = pauVar34 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
          goto LAB_00417f23;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_f8 = a;
            local_e8 = pMVar25;
            Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar6) {
                uVar26 = 0;
                do {
                  if (0 < iVar5) {
                    pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                       (long)this_00->data);
                    pfVar39 = (float *)(local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                                       (long)local_f8[1].data);
                    pauVar34 = (undefined1 (*) [16])
                               (local_f8->cstep * uVar26 * local_f8->elemsize + (long)local_f8->data
                               );
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar4) {
                        uVar54 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar60 = *pauVar34;
                            uVar43 = uVar44;
                            do {
                              fVar2 = pfVar39[1];
                              fVar16 = pfVar39[2];
                              fVar17 = pfVar39[3];
                              *pfVar32 = auVar60._0_4_ * *pfVar39;
                              pfVar32[1] = auVar60._4_4_ * fVar2;
                              pfVar32[2] = auVar60._8_4_ * fVar16;
                              pfVar32[3] = auVar60._12_4_ * fVar17;
                              pfVar39 = pfVar39 + 4;
                              pfVar32 = pfVar32 + 4;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar54 = uVar54 + 1;
                        } while (uVar54 != uVar4);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar5);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar28);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_f8[1].dims != 1) {
            if (local_f8[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  pfVar32 = (float *)(this_00->cstep * uVar28 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)local_f8[1].w * uVar28 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pfVar39 = (float *)(local_f8->cstep * uVar28 * local_f8->elemsize +
                                     (long)local_f8->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *pauVar34;
                      uVar44 = uVar54;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ * *pfVar39;
                        pfVar32[1] = auVar60._4_4_ * fVar2;
                        pfVar32[2] = auVar60._8_4_ * fVar16;
                        pfVar32[3] = auVar60._12_4_ * fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)pMVar25->data + uVar28 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8->cstep;
                  sVar11 = local_f8->elemsize;
                  pvVar35 = local_f8->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                    *pfVar39 = auVar60._0_4_ * *pfVar32;
                    pfVar39[1] = auVar60._4_4_ * fVar2;
                    pfVar39[2] = auVar60._8_4_ * fVar16;
                    pfVar39[3] = auVar60._12_4_ * fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          goto LAB_00417f23;
        }
        if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])
                             ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                  pvVar53 = this_00->data;
                  sVar10 = a->cstep;
                  sVar11 = a->elemsize;
                  pvVar35 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                    *pfVar39 = auVar60._0_4_ * *pfVar32;
                    pfVar39[1] = auVar60._4_4_ * fVar2;
                    pfVar39[2] = auVar60._8_4_ * fVar16;
                    pfVar39[3] = auVar60._12_4_ * fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar53 = this_00->data;
                  pvVar35 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar55 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    fVar2 = *(float *)((long)pvVar35 + lVar29);
                    pfVar32 = (float *)((long)pvVar55 + lVar29 * 4 + sVar10 * sVar11 * uVar28);
                    auVar57._0_4_ = fVar2 * *pfVar32;
                    auVar57._4_4_ = fVar2 * pfVar32[1];
                    auVar57._8_4_ = fVar2 * pfVar32[2];
                    auVar57._12_4_ = fVar2 * pfVar32[3];
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 * 4 + sVar27 * sVar7 * uVar28) =
                         auVar57;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_100 = (__m256 *)sVar7;
        if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar26 * a->elemsize);
                  pvVar53 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26);
                    *pfVar39 = auVar60._0_4_ * *pfVar32;
                    pfVar39[1] = auVar60._4_4_ * fVar2;
                    pfVar39[2] = auVar60._8_4_ * fVar16;
                    pfVar39[3] = auVar60._12_4_ * fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 == uVar54) && (iVar23 == 1)) && (uVar4 == uVar43)) && (uVar42 == 1)) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pvVar53 = a->data;
                  pvVar35 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    fVar2 = *(float *)((long)pvVar53 + lVar29);
                    pfVar32 = (float *)((long)pvVar55 + lVar29 * 4 + sVar10 * sVar11 * uVar26);
                    auVar62._0_4_ = fVar2 * *pfVar32;
                    auVar62._4_4_ = fVar2 * pfVar32[1];
                    auVar62._8_4_ = fVar2 * pfVar32[2];
                    auVar62._12_4_ = fVar2 * pfVar32[3];
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 * 4 + sVar27 * sVar7 * uVar26) =
                         auVar62;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  pvVar53 = a[1].data;
                  pfVar32 = (float *)(this_00->cstep * uVar26 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(a->cstep * uVar26 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar41 * 0x10 + sVar27 * uVar26 * sVar7);
                      uVar42 = uVar54;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ * *pfVar39;
                        pfVar32[1] = auVar60._4_4_ * fVar2;
                        pfVar32[2] = auVar60._8_4_ * fVar16;
                        pfVar32[3] = auVar60._12_4_ * fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f0 = uVar28;
        if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_f0) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = local_f8[1].elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8->cstep * uVar28 * local_f8->elemsize +
                                    (long)local_f8->data);
                  sVar7 = local_f8[1].cstep;
                  pvVar53 = local_f8[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar29 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                        pfVar39 = (float *)((long)pvVar55 + lVar29);
                        auVar65._0_4_ = *pfVar32 * *pfVar39;
                        auVar65._4_4_ = pfVar32[1] * pfVar39[1];
                        auVar65._8_4_ = pfVar32[2] * pfVar39[2];
                        auVar65._12_4_ = pfVar32[3] * pfVar39[3];
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar65;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_f0) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->cstep;
                  sVar7 = local_f8->elemsize;
                  pvVar53 = local_f8->data;
                  pfVar32 = (float *)(this_00->cstep * uVar28 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                                     (long)local_f8[1].data);
                  uVar26 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar26 * 0x10 + sVar27 * uVar28 * sVar7);
                      uVar54 = uVar44;
                      do {
                        fVar2 = pfVar39[1];
                        fVar16 = pfVar39[2];
                        fVar17 = pfVar39[3];
                        *pfVar32 = auVar60._0_4_ * *pfVar39;
                        pfVar32[1] = auVar60._4_4_ * fVar2;
                        pfVar32[2] = auVar60._8_4_ * fVar16;
                        pfVar32[3] = auVar60._12_4_ * fVar17;
                        pfVar39 = pfVar39 + 4;
                        pfVar32 = pfVar32 + 4;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_e8 = pMVar25;
        local_e0 = this_00;
        if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_f0) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                                    (long)local_f8[1].data);
                  sVar7 = local_f8->cstep;
                  pvVar53 = local_f8->data;
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar29 = 0;
                      do {
                        pfVar32 = (float *)((long)pvVar55 + lVar29);
                        pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                        auVar67._0_4_ = *pfVar32 * *pfVar39;
                        auVar67._4_4_ = pfVar32[1] * pfVar39[1];
                        auVar67._8_4_ = pfVar32[2] * pfVar39[2];
                        auVar67._12_4_ = pfVar32[3] * pfVar39[3];
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar67;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar44 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0041acc9;
      case 4:
        local_e8 = pMVar25;
        if (a[1].dims != 4) {
          local_f0 = uVar26;
          Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar23 = a[1].dims;
          if (iVar23 != 1) {
            if (iVar23 == 3) {
              if (0 < (int)local_f0) {
                sVar27 = 0;
                do {
                  if (0 < iVar3) {
                    pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                       (long)this_00->data);
                    pauVar34 = (undefined1 (*) [16])
                               (a[1].cstep * sVar27 * a[1].elemsize + (long)a[1].data);
                    pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            auVar60 = *pauVar34;
                            uVar44 = uVar54;
                            do {
                              fVar2 = pfVar39[1];
                              fVar16 = pfVar39[2];
                              fVar17 = pfVar39[3];
                              *pfVar32 = auVar60._0_4_ * *pfVar39;
                              pfVar32[1] = auVar60._4_4_ * fVar2;
                              pfVar32[2] = auVar60._8_4_ * fVar16;
                              pfVar32[3] = auVar60._12_4_ * fVar17;
                              pfVar39 = pfVar39 + 4;
                              pfVar32 = pfVar32 + 4;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar34 = pauVar34 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar3);
                  }
                  sVar27 = sVar27 + 1;
                } while (sVar27 != local_f0);
                return 0;
              }
              return 0;
            }
            if (iVar23 != 2) {
              return 0;
            }
            if (0 < (int)local_f0) {
              sVar27 = 0;
              do {
                if (0 < iVar3) {
                  pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)a[1].w * sVar27 * a[1].elemsize + (long)a[1].data);
                  pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar60 = *pauVar34;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar54;
                        if (0 < (int)uVar54) {
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            *pfVar32 = auVar60._0_4_ * *pfVar39;
                            pfVar32[1] = auVar60._4_4_ * fVar2;
                            pfVar32[2] = auVar60._8_4_ * fVar16;
                            pfVar32[3] = auVar60._12_4_ * fVar17;
                            pfVar39 = pfVar39 + 4;
                            pfVar32 = pfVar32 + 4;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_f0);
              return 0;
            }
            return 0;
          }
          pMVar25 = local_e8;
          if ((uint)local_110 != 1 || a[1].w != 1) {
            if (0 < (int)local_f0) {
              sVar27 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar7 = a->cstep;
                  sVar10 = a->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_e8->data + sVar27 * 0x10);
                  pvVar53 = a->data;
                  sVar11 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    pfVar39 = (float *)((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27);
                    *pfVar39 = auVar60._0_4_ * *pfVar32;
                    pfVar39[1] = auVar60._4_4_ * fVar2;
                    pfVar39[2] = auVar60._8_4_ * fVar16;
                    pfVar39[3] = auVar60._12_4_ * fVar17;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_f0);
              return 0;
            }
            return 0;
          }
          goto LAB_00417f23;
        }
        goto LAB_0040e8d5;
      }
      goto LAB_00412528;
    case 3:
      pMVar37 = pMVar25;
      goto LAB_0040d784;
    case 4:
      if (3 < a->dims - 1U) {
LAB_0041ac6d:
        return 0;
      }
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      uVar54 = a->w;
      uVar43 = a->h;
      iVar3 = a->d;
      uVar42 = a->c;
      uVar26 = (ulong)uVar42;
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
      sVar27 = a->elemsize;
      uVar44 = a[1].w;
      uVar4 = a[1].h;
      iVar5 = a[1].d;
      uVar6 = a[1].c;
      uVar28 = (ulong)uVar6;
      iVar40 = uVar4 * uVar44 * iVar5;
      sVar7 = a[1].elemsize;
      local_108 = sVar27;
      switch(a->dims) {
      case 1:
        local_e8 = pMVar25;
        if (iVar23 == 1 && uVar54 == 1) {
LAB_0040d526:
          local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
          iVar23 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
                             (a,pMVar25,this_00,opt);
          return iVar23;
        }
        switch(a[1].dims) {
        case 1:
          local_f8 = a;
          Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            a = local_f8;
            if ((uint)local_110 != 1 || local_f8[1].w != 1) {
              binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
                        (local_f8,pMVar25,this_00,local_118);
              return 0;
            }
            goto LAB_00417d91;
          }
          break;
        case 2:
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pauVar34 = (undefined1 (*) [16])this_00->data;
          if (pauVar34 != (undefined1 (*) [16])0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar4) {
              pauVar50 = (undefined1 (*) [16])local_f8->data;
              pauVar51 = (undefined1 (*) [16])local_f8[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar60 = *pauVar50;
                  uVar43 = uVar44;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*pauVar51);
                    *pauVar34 = auVar59;
                    pauVar51 = pauVar51 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          break;
        case 3:
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_f8->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8[1].cstep;
                  sVar11 = local_f8[1].elemsize;
                  pvVar35 = local_f8[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_f8->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8[1].cstep;
                  sVar11 = local_f8[1].elemsize;
                  pvVar35 = local_f8[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          break;
        default:
          goto LAB_0041ac6d;
        }
        return -100;
      case 2:
        pAVar8 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar4) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])
                             (a[1].cstep * uVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)a->w * uVar26 * a->elemsize + (long)a->data);
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *pauVar51;
                      uVar43 = uVar44;
                      do {
                        auVar59 = vmaxps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar5) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)local_f8->w * uVar26 * local_f8->elemsize + (long)local_f8->data
                             );
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      auVar60 = *pauVar51;
                      uVar54 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            auVar59 = vmaxps_avx(auVar60,*pauVar50);
                            *pauVar34 = auVar59;
                            pauVar50 = pauVar50 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    pauVar51 = pauVar51 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar24 = local_f8[1].dims;
        if (iVar24 == 1) {
          Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
          pauVar34 = (undefined1 (*) [16])this_00->data;
          if (pauVar34 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar43) {
              pauVar50 = (undefined1 (*) [16])local_f8->data;
              pauVar51 = (undefined1 (*) [16])local_f8[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar60 = *pauVar51;
                  uVar44 = uVar54;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*pauVar50);
                    *pauVar34 = auVar59;
                    pauVar50 = pauVar50 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar51 = pauVar51 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
LAB_00417d91:
          iVar23 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
                             (a,pMVar25,this_00,local_118);
          return iVar23;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_f8 = a;
            local_e8 = pMVar25;
            Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar6) {
                uVar26 = 0;
                do {
                  if (0 < iVar5) {
                    pauVar34 = (undefined1 (*) [16])
                               (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                    pauVar50 = (undefined1 (*) [16])
                               (local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                               (long)local_f8[1].data);
                    pauVar51 = (undefined1 (*) [16])
                               (local_f8->cstep * uVar26 * local_f8->elemsize + (long)local_f8->data
                               );
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar4) {
                        uVar54 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar60 = *pauVar51;
                            uVar43 = uVar44;
                            do {
                              auVar59 = vmaxps_avx(auVar60,*pauVar50);
                              *pauVar34 = auVar59;
                              pauVar50 = pauVar50 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar51 = pauVar51 + 1;
                          uVar54 = uVar54 + 1;
                        } while (uVar54 != uVar4);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar5);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar28);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_f8[1].dims != 1) {
            if (local_f8[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)local_f8[1].w * uVar28 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8->cstep * uVar28 * local_f8->elemsize + (long)local_f8->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *pauVar51;
                      uVar44 = uVar54;
                      do {
                        auVar59 = vmaxps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)pMVar25->data + uVar28 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8->cstep;
                  sVar11 = local_f8->elemsize;
                  pvVar35 = local_f8->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          goto LAB_00417d91;
        }
        local_f0 = sVar7;
        if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])
                             ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                  pvVar53 = this_00->data;
                  sVar10 = a->cstep;
                  sVar11 = a->elemsize;
                  pvVar35 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar53 = this_00->data;
                  pvVar35 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar55 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar35 + lVar29);
                    auVar56._4_4_ = uVar1;
                    auVar56._0_4_ = uVar1;
                    auVar56._8_4_ = uVar1;
                    auVar56._12_4_ = uVar1;
                    auVar60 = vmaxps_avx(auVar56,*(undefined1 (*) [16])
                                                  ((long)pvVar55 +
                                                  lVar29 * 4 + sVar10 * sVar11 * uVar28));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 * 4 + sVar27 * sVar7 * uVar28) =
                         auVar60;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar26 * a->elemsize);
                  pvVar53 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26)
                                        );
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar44 == uVar54) && (iVar23 == 1)) && ((uVar4 == uVar43 && (uVar42 == 1)))) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pvVar53 = a->data;
                  pvVar35 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar53 + lVar29);
                    auVar61._4_4_ = uVar1;
                    auVar61._0_4_ = uVar1;
                    auVar61._8_4_ = uVar1;
                    auVar61._12_4_ = uVar1;
                    auVar60 = vmaxps_avx(auVar61,*(undefined1 (*) [16])
                                                  ((long)pvVar55 +
                                                  lVar29 * 4 + sVar10 * sVar11 * uVar26));
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 * 4 + sVar27 * sVar7 * uVar26) =
                         auVar60;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  pvVar53 = a[1].data;
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])(a->cstep * uVar26 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar41 * 0x10 + sVar27 * uVar26 * sVar7);
                      uVar42 = uVar54;
                      do {
                        auVar59 = vmaxps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_100 = (__m256 *)uVar28;
        if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_100) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = local_f8[1].elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8->cstep * uVar28 * local_f8->elemsize +
                                    (long)local_f8->data);
                  sVar7 = local_f8[1].cstep;
                  pvVar53 = local_f8[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar29 = 0;
                      do {
                        auVar60 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar55 + lVar29),
                                             *(undefined1 (*) [16])
                                              ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28));
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar60;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while ((__m256 *)uVar28 != local_100);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_100) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->cstep;
                  sVar7 = local_f8->elemsize;
                  pvVar53 = local_f8->data;
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  uVar26 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar26 * 0x10 + sVar27 * uVar28 * sVar7);
                      uVar54 = uVar44;
                      do {
                        auVar59 = vmaxps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while ((__m256 *)uVar28 != local_100);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_e8 = pMVar25;
        if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_100) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                                    (long)local_f8[1].data);
                  sVar7 = local_f8->cstep;
                  pvVar53 = local_f8->data;
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar29 = 0;
                      do {
                        auVar60 = vmaxps_avx(*(undefined1 (*) [16])
                                              ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28),
                                             *(undefined1 (*) [16])((long)pvVar55 + lVar29));
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar60;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar44 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while ((__m256 *)uVar28 != local_100);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0041acb9;
      case 4:
        local_e8 = pMVar25;
        if (a[1].dims != 4) {
          local_f0 = uVar26;
          Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar23 = a[1].dims;
          if (iVar23 != 1) {
            if (iVar23 == 3) {
              if (0 < (int)local_f0) {
                sVar27 = 0;
                do {
                  if (0 < iVar3) {
                    pauVar34 = (undefined1 (*) [16])
                               (this_00->cstep * sVar27 * this_00->elemsize + (long)this_00->data);
                    pauVar51 = (undefined1 (*) [16])
                               (a[1].cstep * sVar27 * a[1].elemsize + (long)a[1].data);
                    pauVar50 = (undefined1 (*) [16])
                               (a->cstep * sVar27 * a->elemsize + (long)a->data);
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            auVar60 = *pauVar51;
                            uVar44 = uVar54;
                            do {
                              auVar59 = vmaxps_avx(auVar60,*pauVar50);
                              *pauVar34 = auVar59;
                              pauVar50 = pauVar50 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar51 = pauVar51 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar3);
                  }
                  sVar27 = sVar27 + 1;
                } while (sVar27 != local_f0);
                return 0;
              }
              return 0;
            }
            if (iVar23 != 2) {
              return 0;
            }
            if (0 < (int)local_f0) {
              sVar27 = 0;
              do {
                if (0 < iVar3) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * sVar27 * this_00->elemsize + (long)this_00->data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)a[1].w * sVar27 * a[1].elemsize + (long)a[1].data);
                  pauVar50 = (undefined1 (*) [16])(a->cstep * sVar27 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar60 = *pauVar51;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar54;
                        if (0 < (int)uVar54) {
                          do {
                            auVar59 = vmaxps_avx(auVar60,*pauVar50);
                            *pauVar34 = auVar59;
                            pauVar50 = pauVar50 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar51 = pauVar51 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_f0);
              return 0;
            }
            return 0;
          }
          pMVar25 = local_e8;
          if ((uint)local_110 != 1 || a[1].w != 1) {
            if (0 < (int)local_f0) {
              sVar27 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar7 = a->cstep;
                  sVar10 = a->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_e8->data + sVar27 * 0x10);
                  pvVar53 = a->data;
                  sVar11 = this_00->cstep;
                  sVar9 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    auVar59 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27)
                                        );
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_f0);
              return 0;
            }
            return 0;
          }
          goto LAB_00417d91;
        }
        goto LAB_0040e676;
      }
      goto LAB_00412074;
    case 5:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      uVar54 = a->w;
      uVar43 = a->h;
      iVar3 = a->d;
      uVar42 = a->c;
      uVar26 = (ulong)uVar42;
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
      sVar27 = a->elemsize;
      uVar44 = a[1].w;
      uVar4 = a[1].h;
      iVar5 = a[1].d;
      uVar6 = a[1].c;
      uVar28 = (ulong)uVar6;
      iVar40 = uVar4 * uVar44 * iVar5;
      sVar7 = a[1].elemsize;
      local_108 = uVar28;
      local_f0 = sVar27;
      switch(a->dims) {
      case 1:
        if (iVar23 == 1 && uVar54 == 1) {
LAB_0040d69c:
          local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
          iVar23 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
                             (a,pMVar25,this_00,opt);
          return iVar23;
        }
        switch(a[1].dims) {
        case 1:
          local_f8 = a;
          Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
                      (local_f8,pMVar25,this_00,local_118);
            return 0;
          }
          break;
        case 2:
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pauVar34 = (undefined1 (*) [16])this_00->data;
          if (pauVar34 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar50 = (undefined1 (*) [16])local_f8->data;
              pauVar51 = (undefined1 (*) [16])local_f8[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar60 = *pauVar50;
                  uVar43 = uVar44;
                  do {
                    auVar59 = vminps_avx(auVar60,*pauVar51);
                    *pauVar34 = auVar59;
                    pauVar51 = pauVar51 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_f8->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8[1].cstep;
                  sVar11 = local_f8[1].elemsize;
                  pvVar35 = local_f8[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar59 = vminps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_f8->data + uVar26 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8[1].cstep;
                  sVar11 = local_f8[1].elemsize;
                  pvVar35 = local_f8[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar59 = vminps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          goto LAB_0041ac6d;
        }
LAB_004180c2:
        iVar23 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
                           (a,pMVar25,this_00,local_118);
        return iVar23;
      case 2:
        pAVar8 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar4) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])
                             (a[1].cstep * uVar26 * a[1].elemsize + (long)a[1].data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)a->w * uVar26 * a->elemsize + (long)a->data);
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *pauVar51;
                      uVar43 = uVar44;
                      do {
                        auVar59 = vminps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar43 = uVar43 - 1;
                      } while (uVar43 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar5) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)local_f8->w * uVar26 * local_f8->elemsize + (long)local_f8->data
                             );
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      auVar60 = *pauVar51;
                      uVar54 = 0;
                      do {
                        uVar43 = uVar44;
                        if (0 < (int)uVar44) {
                          do {
                            auVar59 = vminps_avx(auVar60,*pauVar50);
                            *pauVar34 = auVar59;
                            pauVar50 = pauVar50 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    pauVar51 = pauVar51 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar24 = local_f8[1].dims;
        if (iVar24 == 1) {
          Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
          pauVar34 = (undefined1 (*) [16])this_00->data;
          if (pauVar34 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar43) {
              pauVar50 = (undefined1 (*) [16])local_f8->data;
              pauVar51 = (undefined1 (*) [16])local_f8[1].data;
              uVar42 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar60 = *pauVar51;
                  uVar44 = uVar54;
                  do {
                    auVar59 = vminps_avx(auVar60,*pauVar50);
                    *pauVar34 = auVar59;
                    pauVar50 = pauVar50 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pauVar51 = pauVar51 + 1;
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar43);
              return 0;
            }
            return 0;
          }
          goto LAB_004180c2;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_f8 = a;
            Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar6) {
                uVar26 = 0;
                do {
                  if (0 < iVar5) {
                    pauVar34 = (undefined1 (*) [16])
                               (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                    pauVar50 = (undefined1 (*) [16])
                               (local_f8[1].cstep * uVar26 * local_f8[1].elemsize +
                               (long)local_f8[1].data);
                    pauVar51 = (undefined1 (*) [16])
                               (local_f8->cstep * uVar26 * local_f8->elemsize + (long)local_f8->data
                               );
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar4) {
                        uVar54 = 0;
                        do {
                          if (0 < (int)uVar44) {
                            auVar60 = *pauVar51;
                            uVar43 = uVar44;
                            do {
                              auVar59 = vminps_avx(auVar60,*pauVar50);
                              *pauVar34 = auVar59;
                              pauVar50 = pauVar50 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar43 = uVar43 - 1;
                            } while (uVar43 != 0);
                          }
                          pauVar51 = pauVar51 + 1;
                          uVar54 = uVar54 + 1;
                        } while (uVar54 != uVar4);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar5);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar28);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_f8[1].dims != 1) {
            if (local_f8[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)local_f8[1].w * uVar28 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8->cstep * uVar28 * local_f8->elemsize + (long)local_f8->data);
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *pauVar51;
                      uVar44 = uVar54;
                      do {
                        auVar59 = vminps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar44 = uVar44 - 1;
                      } while (uVar44 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          a = local_f8;
          if ((uint)local_110 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)pMVar25->data + uVar28 * 0x10);
                  pvVar53 = this_00->data;
                  sVar10 = local_f8->cstep;
                  sVar11 = local_f8->elemsize;
                  pvVar35 = local_f8->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    auVar59 = vminps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          goto LAB_004180c2;
        }
        local_d8 = sVar7;
        if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar60 = *(undefined1 (*) [16])
                             ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                  pvVar53 = this_00->data;
                  sVar10 = a->cstep;
                  sVar11 = a->elemsize;
                  pvVar35 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    auVar59 = vminps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28
                                                  ));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar42) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar53 = this_00->data;
                  pvVar35 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar55 = a->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar35 + lVar29);
                    auVar59._4_4_ = uVar1;
                    auVar59._0_4_ = uVar1;
                    auVar59._8_4_ = uVar1;
                    auVar59._12_4_ = uVar1;
                    auVar60 = vminps_avx(auVar59,*(undefined1 (*) [16])
                                                  ((long)pvVar55 +
                                                  lVar29 * 4 + sVar10 * sVar11 * uVar28));
                    *(undefined1 (*) [16])((long)pvVar53 + lVar29 * 4 + sVar27 * sVar7 * uVar28) =
                         auVar60;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar26 * a->elemsize);
                  pvVar53 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar59 = vminps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar26)
                                        );
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar26) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 == uVar54) && (iVar23 == 1)) && (uVar4 == uVar43)) && (uVar42 == 1)) {
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  pvVar53 = a->data;
                  pvVar35 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar55 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar53 + lVar29);
                    auVar64._4_4_ = uVar1;
                    auVar64._0_4_ = uVar1;
                    auVar64._8_4_ = uVar1;
                    auVar64._12_4_ = uVar1;
                    auVar60 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                                  ((long)pvVar55 +
                                                  lVar29 * 4 + sVar10 * sVar11 * uVar26));
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 * 4 + sVar27 * sVar7 * uVar26) =
                         auVar60;
                    lVar29 = lVar29 + 4;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = a[1].cstep;
                  sVar7 = a[1].elemsize;
                  pvVar53 = a[1].data;
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])(a->cstep * uVar26 * a->elemsize + (long)a->data);
                  uVar41 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar41 * 0x10 + sVar27 * uVar26 * sVar7);
                      uVar42 = uVar54;
                      do {
                        auVar59 = vminps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar42 = uVar42 - 1;
                      } while (uVar42 != 0);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 != uVar43);
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar28);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_108) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar43) {
                  sVar27 = local_f8[1].elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8->cstep * uVar28 * local_f8->elemsize +
                                    (long)local_f8->data);
                  sVar7 = local_f8[1].cstep;
                  pvVar53 = local_f8[1].data;
                  uVar42 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar29 = 0;
                      do {
                        auVar60 = vminps_avx(*(undefined1 (*) [16])((long)pvVar55 + lVar29),
                                             *(undefined1 (*) [16])
                                              ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28));
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar60;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar43);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_108);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
          local_f8 = a;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_108) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->cstep;
                  sVar7 = local_f8->elemsize;
                  pvVar53 = local_f8->data;
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  uVar26 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      auVar60 = *(undefined1 (*) [16])
                                 ((long)pvVar53 + uVar26 * 0x10 + sVar27 * uVar28 * sVar7);
                      uVar54 = uVar44;
                      do {
                        auVar59 = vminps_avx(auVar60,*pauVar50);
                        *pauVar34 = auVar59;
                        pauVar50 = pauVar50 + 1;
                        pauVar34 = pauVar34 + 1;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_108);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_e8 = pMVar25;
        if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_108) {
              uVar28 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar27 = local_f8->elemsize;
                  pvVar35 = (void *)(this_00->cstep * uVar28 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar55 = (void *)(local_f8[1].cstep * uVar28 * local_f8[1].elemsize +
                                    (long)local_f8[1].data);
                  sVar7 = local_f8->cstep;
                  pvVar53 = local_f8->data;
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      lVar29 = 0;
                      do {
                        auVar60 = vminps_avx(*(undefined1 (*) [16])
                                              ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28),
                                             *(undefined1 (*) [16])((long)pvVar55 + lVar29));
                        *(undefined1 (*) [16])((long)pvVar35 + lVar29) = auVar60;
                        lVar29 = lVar29 + 0x10;
                      } while ((ulong)uVar44 << 4 != lVar29);
                      pvVar35 = (void *)((long)pvVar35 + lVar29);
                      pvVar55 = (void *)((long)pvVar55 + lVar29);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar4);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_108);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0041acf8;
      case 4:
        if (a[1].dims != 4) {
          local_108 = uVar26;
          local_e8 = pMVar25;
          Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar23 = a[1].dims;
          if (iVar23 != 1) {
            if (iVar23 == 3) {
              if (0 < (int)local_108) {
                uVar28 = 0;
                do {
                  if (0 < iVar3) {
                    pauVar34 = (undefined1 (*) [16])
                               (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                    pauVar51 = (undefined1 (*) [16])
                               (a[1].cstep * uVar28 * a[1].elemsize + (long)a[1].data);
                    pauVar50 = (undefined1 (*) [16])
                               (a->cstep * uVar28 * a->elemsize + (long)a->data);
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar43) {
                        uVar42 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            auVar60 = *pauVar51;
                            uVar44 = uVar54;
                            do {
                              auVar59 = vminps_avx(auVar60,*pauVar50);
                              *pauVar34 = auVar59;
                              pauVar50 = pauVar50 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar44 = uVar44 - 1;
                            } while (uVar44 != 0);
                          }
                          pauVar51 = pauVar51 + 1;
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar43);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar3);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != local_108);
                return 0;
              }
              return 0;
            }
            if (iVar23 != 2) {
              return 0;
            }
            if (0 < (int)local_108) {
              uVar28 = 0;
              do {
                if (0 < iVar3) {
                  pauVar34 = (undefined1 (*) [16])
                             (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                  pauVar51 = (undefined1 (*) [16])
                             ((long)a[1].w * uVar28 * a[1].elemsize + (long)a[1].data);
                  pauVar50 = (undefined1 (*) [16])(a->cstep * uVar28 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      auVar60 = *pauVar51;
                      uVar42 = 0;
                      do {
                        uVar44 = uVar54;
                        if (0 < (int)uVar54) {
                          do {
                            auVar59 = vminps_avx(auVar60,*pauVar50);
                            *pauVar34 = auVar59;
                            pauVar50 = pauVar50 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    pauVar51 = pauVar51 + 1;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_108);
              return 0;
            }
            return 0;
          }
          pMVar25 = local_e8;
          if ((uint)local_110 != 1 || a[1].w != 1) {
            if (0 < (int)local_108) {
              uVar28 = 0;
              do {
                if (0 < (int)local_100) {
                  sVar27 = a->cstep;
                  sVar7 = a->elemsize;
                  auVar60 = *(undefined1 (*) [16])((long)local_e8->data + uVar28 * 0x10);
                  pvVar53 = a->data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar35 = this_00->data;
                  lVar29 = 0;
                  iVar23 = (int)local_100;
                  do {
                    auVar59 = vminps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28)
                                        );
                    *(undefined1 (*) [16])((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28) =
                         auVar59;
                    lVar29 = lVar29 + 0x10;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_108);
              return 0;
            }
            return 0;
          }
          goto LAB_004180c2;
        }
        goto LAB_0040ef14;
      }
      goto LAB_0041287e;
    case 6:
      if (a->dims - 1U < 4) {
        uVar54 = a->w;
        local_100 = (__m256 *)(ulong)uVar54;
        uVar43 = a->h;
        local_110 = (__m256 *)(ulong)uVar43;
        iVar23 = a->d;
        uVar42 = a->c;
        uVar28 = (ulong)uVar42;
        local_e8 = (Mat *)CONCAT44(local_e8._4_4_,uVar43 * uVar54 * iVar23);
        local_60 = a->elemsize;
        iVar24 = a->elempack;
        local_d0 = CONCAT44(local_d0._4_4_,iVar24);
        uVar44 = a[1].w;
        local_118 = (Option *)(ulong)uVar44;
        uVar4 = a[1].h;
        iVar3 = a[1].d;
        uVar6 = a[1].c;
        local_f0 = (ulong)uVar6;
        local_108 = CONCAT44(local_108._4_4_,iVar3);
        iVar40 = uVar4 * uVar44 * iVar3;
        local_c8 = a[1].elemsize;
        iVar5 = a[1].elempack;
        switch(a->dims) {
        case 1:
          if (iVar24 == 1 && uVar54 == 1) {
            iVar23 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                               (a,pMVar25,this_00,opt);
            return iVar23;
          }
          switch(a[1].dims) {
          case 1:
            local_f8 = a;
            local_e8 = pMVar25;
            Mat::create(this_00,uVar54,local_60,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pMVar25 = local_e8;
            if (iVar5 == 1 && local_f8[1].w == 1) goto LAB_00418053;
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                      (local_f8,local_e8,this_00,opt);
            break;
          case 2:
            local_f8 = a;
            Mat::create(this_00,uVar44,uVar4,local_c8,iVar5,opt->blob_allocator);
            puVar36 = (undefined8 *)this_00->data;
            if (puVar36 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar4) {
                local_110 = (__m256 *)local_f8->data;
                pauVar34 = (undefined1 (*) [16])local_f8[1].data;
                local_100 = (__m256 *)((ulong)local_100 & 0xffffffff00000000);
                do {
                  local_a0._0_16_ = *(undefined1 (*) [16])local_110;
                  uVar28 = (ulong)local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      uVar90 = *(undefined8 *)((long)*pauVar34 + 8);
                      local_c0._0_16_ = *pauVar34;
                      afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                          (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                      *puVar36 = afVar94._0_8_;
                      puVar36[1] = uVar90;
                      pauVar34 = pauVar34 + 1;
                      puVar36 = puVar36 + 2;
                      uVar54 = (int)uVar28 - 1;
                      uVar28 = (ulong)uVar54;
                    } while (uVar54 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 0x10);
                  uVar54 = (int)local_100 + 1;
                  local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar54);
                } while (uVar54 != uVar4);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar40);
            local_f8 = a;
            local_e0 = this_00;
            Mat::create(this_00,uVar44,uVar4,uVar6,local_c8,iVar5,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_110 = (__m256 *)0x0;
                do {
                  local_a0._0_16_ =
                       *(undefined1 (*) [16])((long)local_f8->data + (long)local_110 * 0x10);
                  if (0 < (int)local_e8) {
                    lVar52 = local_e0->cstep * local_e0->elemsize * (long)local_110;
                    pvVar53 = local_e0->data;
                    local_118 = (Option *)
                                (local_f8[1].cstep * local_f8[1].elemsize * (long)local_110 +
                                (long)local_f8[1].data);
                    lVar29 = 0;
                    iVar23 = (int)local_e8;
                    do {
                      uVar90 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_118 + lVar29) + 8)
                      ;
                      local_c0._0_16_ = *(undefined1 (*) [16])((long)local_118 + lVar29);
                      afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                          (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                      puVar36 = (undefined8 *)((long)pvVar53 + lVar29 + lVar52);
                      *puVar36 = afVar94._0_8_;
                      puVar36[1] = uVar90;
                      lVar29 = lVar29 + 0x10;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 1);
                } while (local_110 != (__m256 *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          case 4:
            local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar40);
            local_f8 = a;
            local_e0 = this_00;
            Mat::create(this_00,uVar44,uVar4,iVar3,uVar6,local_c8,iVar5,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_110 = (__m256 *)0x0;
                do {
                  local_a0._0_16_ =
                       *(undefined1 (*) [16])((long)local_f8->data + (long)local_110 * 0x10);
                  if (0 < (int)local_e8) {
                    lVar52 = local_e0->cstep * local_e0->elemsize * (long)local_110;
                    pvVar53 = local_e0->data;
                    local_118 = (Option *)
                                (local_f8[1].cstep * local_f8[1].elemsize * (long)local_110 +
                                (long)local_f8[1].data);
                    lVar29 = 0;
                    iVar23 = (int)local_e8;
                    do {
                      uVar90 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_118 + lVar29) + 8)
                      ;
                      local_c0._0_16_ = *(undefined1 (*) [16])((long)local_118 + lVar29);
                      afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                          (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                      puVar36 = (undefined8 *)((long)pvVar53 + lVar29 + lVar52);
                      *puVar36 = afVar94._0_8_;
                      puVar36[1] = uVar90;
                      lVar29 = lVar29 + 0x10;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 1);
                } while (local_110 != (__m256 *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          break;
        case 2:
          pAVar8 = opt->blob_allocator;
          if (a[1].dims == 3) {
            local_f8 = a;
            local_e0 = this_00;
            local_64 = iVar5;
            Mat::create(this_00,uVar44,uVar4,uVar6,local_c8,iVar5,pAVar8);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_108 = 0;
                do {
                  if (0 < (int)uVar4) {
                    pauVar34 = (undefined1 (*) [16])
                               (local_e0->cstep * local_108 * local_e0->elemsize +
                               (long)local_e0->data);
                    pauVar50 = (undefined1 (*) [16])
                               (local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                               (long)local_f8[1].data);
                    local_110 = (__m256 *)
                                ((long)local_f8->w * local_108 * local_f8->elemsize +
                                (long)local_f8->data);
                    uVar54 = 0;
                    do {
                      local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar54);
                      local_a0._0_16_ = *(undefined1 (*) [16])local_110;
                      uVar28 = (ulong)local_118 & 0xffffffff;
                      if (0 < (int)local_118) {
                        do {
                          auVar91 = ZEXT856(*(ulong *)((long)*pauVar50 + 8));
                          local_c0._0_16_ = *pauVar50;
                          afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                              (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                          auVar80._0_8_ = afVar94._0_8_;
                          auVar80._8_56_ = auVar91;
                          *pauVar34 = auVar80._0_16_;
                          pauVar50 = pauVar50 + 1;
                          pauVar34 = pauVar34 + 1;
                          uVar54 = (int)uVar28 - 1;
                          uVar28 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      local_110 = (__m256 *)((long)local_110 + 0x10);
                      uVar54 = (int)local_100 + 1;
                    } while (uVar54 != uVar4);
                  }
                  local_108 = local_108 + 1;
                } while (local_108 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (a[1].dims == 4) {
            local_f8 = a;
            local_e0 = this_00;
            local_64 = iVar5;
            Mat::create(this_00,uVar44,uVar4,iVar3,uVar6,local_c8,iVar5,pAVar8);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_d8 = 0;
                do {
                  if (0 < (int)local_108) {
                    pauVar34 = (undefined1 (*) [16])
                               (local_e0->cstep * local_d8 * local_e0->elemsize +
                               (long)local_e0->data);
                    pauVar50 = (undefined1 (*) [16])
                               (local_f8[1].cstep * local_d8 * local_f8[1].elemsize +
                               (long)local_f8[1].data);
                    local_100 = (__m256 *)
                                ((long)local_f8->w * local_d8 * local_f8->elemsize +
                                (long)local_f8->data);
                    iVar23 = 0;
                    do {
                      local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                      local_a0._0_16_ = *(undefined1 (*) [16])local_100;
                      if (0 < (int)uVar4) {
                        uVar54 = 0;
                        do {
                          local_110 = (__m256 *)CONCAT44(local_110._4_4_,uVar54);
                          uVar28 = (ulong)local_118 & 0xffffffff;
                          if (0 < (int)local_118) {
                            do {
                              auVar91 = ZEXT856(*(ulong *)((long)*pauVar50 + 8));
                              local_c0._0_16_ = *pauVar50;
                              afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                  (&local_119,(__m128 *)local_a0,(__m128 *)local_c0)
                              ;
                              auVar78._0_8_ = afVar94._0_8_;
                              auVar78._8_56_ = auVar91;
                              *pauVar34 = auVar78._0_16_;
                              pauVar50 = pauVar50 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar54 = (int)uVar28 - 1;
                              uVar28 = (ulong)uVar54;
                            } while (uVar54 != 0);
                          }
                          uVar54 = (uint)local_110 + 1;
                        } while (uVar54 != uVar4);
                      }
                      local_100 = (__m256 *)((long)local_100 + 0x10);
                      iVar23 = (int)local_e8 + 1;
                    } while (iVar23 != (int)local_108);
                  }
                  local_d8 = local_d8 + 1;
                } while (local_d8 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          local_64 = iVar5;
          Mat::create(this_00,uVar54,uVar43,local_60,iVar24,pAVar8);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_f8[1].dims == 1) {
            Mat::create(this_00,uVar54,(int)local_110,local_60,(int)local_d0,opt->blob_allocator);
            puVar36 = (undefined8 *)this_00->data;
            if (puVar36 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (local_64 != 1 || local_f8[1].w != 1) {
              if (0 < (int)(uint)local_110) {
                pauVar34 = (undefined1 (*) [16])local_f8->data;
                local_128 = (__m256 *)local_f8[1].data;
                local_118 = (Option *)((ulong)local_118 & 0xffffffff00000000);
                do {
                  local_a0._0_16_ = *(undefined1 (*) [16])local_128;
                  uVar28 = (ulong)local_100 & 0xffffffff;
                  if (0 < (int)local_100) {
                    do {
                      uVar90 = *(undefined8 *)((long)*pauVar34 + 8);
                      local_c0._0_16_ = *pauVar34;
                      afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                          (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                      *puVar36 = afVar94._0_8_;
                      puVar36[1] = uVar90;
                      pauVar34 = pauVar34 + 1;
                      puVar36 = puVar36 + 2;
                      uVar54 = (int)uVar28 - 1;
                      uVar28 = (ulong)uVar54;
                    } while (uVar54 != 0);
                  }
                  local_128 = (__m256 *)((long)local_128 + 0x10);
                  iVar23 = (int)local_118 + 1;
                  local_118 = (Option *)CONCAT44(local_118._4_4_,iVar23);
                } while (iVar23 != (uint)local_110);
                return 0;
              }
              return 0;
            }
LAB_00418053:
            iVar23 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                               (local_f8,pMVar25,this_00,opt);
            return iVar23;
          }
          a = local_f8;
          if (local_f8[1].dims != 2) {
            return 0;
          }
LAB_0040ef48:
          iVar23 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                             (a,pMVar25,this_00,opt);
          return iVar23;
        case 3:
          if (a[1].dims == 3) {
            if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
              local_f8 = a;
              local_e0 = this_00;
              local_64 = iVar5;
              Mat::create(this_00,uVar54,uVar43,uVar42,local_60,iVar24,opt->blob_allocator);
              if (local_e0->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)uVar42) {
                  local_110 = (__m256 *)0x0;
                  local_d8 = uVar28;
                  do {
                    pvVar53 = local_f8->data;
                    local_a0._0_16_ =
                         *(undefined1 (*) [16])
                          ((long)local_f8[1].data +
                          local_f8[1].cstep * (long)local_110 * local_f8[1].elemsize);
                    if (0 < (int)local_e8) {
                      local_118 = (Option *)
                                  ((long)local_e0->data +
                                  local_e0->cstep * local_e0->elemsize * (long)local_110);
                      lVar29 = local_f8->cstep * local_f8->elemsize * (long)local_110;
                      lVar52 = 0;
                      iVar23 = (int)local_e8;
                      do {
                        pauVar34 = (undefined1 (*) [16])((long)pvVar53 + lVar52 + lVar29);
                        uVar90 = *(undefined8 *)(*pauVar34 + 8);
                        local_c0._0_16_ = *pauVar34;
                        afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                            (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                        *(undefined8 *)((long)local_118 + lVar52) = afVar94._0_8_;
                        ((undefined8 *)((long)local_118 + lVar52))[1] = uVar90;
                        lVar52 = lVar52 + 0x10;
                        iVar23 = iVar23 + -1;
                      } while (iVar23 != 0);
                    }
                    local_110 = (__m256 *)((long)local_110 + 1);
                  } while (local_110 != (__m256 *)local_d8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar44 == uVar54) && (iVar5 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
              local_f8 = a;
              local_e0 = this_00;
              local_d8 = uVar28;
              local_64 = iVar5;
              Mat::create(this_00,uVar54,uVar43,uVar42,local_60,iVar24,opt->blob_allocator);
              if (local_e0->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_d8) {
                  local_100 = (__m256 *)0x0;
                  do {
                    if (0 < (int)local_e8) {
                      lVar29 = local_e0->cstep * local_e0->elemsize * (long)local_100;
                      pvVar53 = local_e0->data;
                      local_110 = (__m256 *)local_f8[1].data;
                      local_118 = (Option *)
                                  (local_f8->cstep * local_f8->elemsize * (long)local_100 +
                                  (long)local_f8->data);
                      lVar52 = 0;
                      iVar23 = (int)local_e8;
                      do {
                        local_a0._0_16_ = *(undefined1 (*) [16])((long)local_118 + lVar52 * 4);
                        uVar1 = *(undefined4 *)((long)local_110 + lVar52);
                        auVar60._4_4_ = uVar1;
                        auVar60._0_4_ = uVar1;
                        auVar60._8_4_ = uVar1;
                        auVar60._12_4_ = uVar1;
                        auVar91 = ZEXT856(auVar60._8_8_);
                        local_c0[0] = (float)uVar1;
                        local_c0[1] = (float)uVar1;
                        local_c0[2] = (float)uVar1;
                        local_c0[3] = (float)uVar1;
                        afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                            (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                        auVar82._0_8_ = afVar94._0_8_;
                        auVar82._8_56_ = auVar91;
                        *(undefined1 (*) [16])((long)pvVar53 + lVar52 * 4 + lVar29) = auVar82._0_16_
                        ;
                        lVar52 = lVar52 + 4;
                        iVar23 = iVar23 + -1;
                      } while (iVar23 != 0);
                    }
                    local_100 = (__m256 *)((long)local_100 + 1);
                  } while (local_100 != (__m256 *)local_d8);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar40);
            if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
              local_f8 = a;
              local_e0 = this_00;
              local_64 = iVar5;
              Mat::create(this_00,uVar44,uVar4,uVar6,local_c8,iVar5,opt->blob_allocator);
              if (local_e0->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_f0) {
                  local_110 = (__m256 *)0x0;
                  do {
                    pvVar53 = local_e0->data;
                    local_a0._0_16_ =
                         *(undefined1 (*) [16])
                          ((long)local_f8->data +
                          local_f8->cstep * (long)local_110 * local_f8->elemsize);
                    if (0 < (int)local_e8) {
                      local_118 = (Option *)
                                  ((long)local_f8[1].data +
                                  local_f8[1].cstep * local_f8[1].elemsize * (long)local_110);
                      lVar29 = local_e0->cstep * local_e0->elemsize * (long)local_110;
                      lVar52 = 0;
                      iVar23 = (int)local_e8;
                      do {
                        uVar90 = *(undefined8 *)
                                  (*(undefined1 (*) [16])((long)local_118 + lVar52) + 8);
                        local_c0._0_16_ = *(undefined1 (*) [16])((long)local_118 + lVar52);
                        afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                            (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                        puVar36 = (undefined8 *)((long)pvVar53 + lVar52 + lVar29);
                        *puVar36 = afVar94._0_8_;
                        puVar36[1] = uVar90;
                        lVar52 = lVar52 + 0x10;
                        iVar23 = iVar23 + -1;
                      } while (iVar23 != 0);
                    }
                    local_110 = (__m256 *)((long)local_110 + 1);
                  } while (local_110 != (__m256 *)local_f0);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar42 == 1 && uVar4 == uVar43))) {
              local_f8 = a;
              local_e0 = this_00;
              local_64 = iVar5;
              Mat::create(this_00,uVar44,uVar4,uVar6,local_c8,iVar5,opt->blob_allocator);
              if (local_e0->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_f0) {
                  local_100 = (__m256 *)0x0;
                  do {
                    if (0 < (int)local_e8) {
                      local_118 = (Option *)local_f8->data;
                      lVar29 = local_e0->cstep * local_e0->elemsize * (long)local_100;
                      pvVar53 = local_e0->data;
                      local_110 = (__m256 *)
                                  (local_f8[1].cstep * local_f8[1].elemsize * (long)local_100 +
                                  (long)local_f8[1].data);
                      lVar52 = 0;
                      iVar23 = (int)local_e8;
                      do {
                        afVar22 = local_a0;
                        local_a0[1] = *(float *)((long)local_118 + lVar52);
                        local_a0[0] = local_a0[1];
                        local_a0[2] = local_a0[1];
                        local_a0._16_16_ = afVar22._16_16_;
                        local_a0[3] = local_a0[1];
                        pauVar34 = (undefined1 (*) [16])((long)local_110 + lVar52 * 4);
                        auVar91 = ZEXT856(*(ulong *)((long)*pauVar34 + 8));
                        local_c0._0_16_ = *pauVar34;
                        afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                            (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                        auVar83._0_8_ = afVar94._0_8_;
                        auVar83._8_56_ = auVar91;
                        *(undefined1 (*) [16])((long)pvVar53 + lVar52 * 4 + lVar29) = auVar83._0_16_
                        ;
                        lVar52 = lVar52 + 4;
                        iVar23 = iVar23 + -1;
                      } while (iVar23 != 0);
                    }
                    local_100 = (__m256 *)((long)local_100 + 1);
                  } while (local_100 != (__m256 *)local_f0);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
              local_f8 = a;
              local_e0 = this_00;
              local_d8 = uVar28;
              local_64 = iVar5;
              Mat::create(this_00,uVar54,uVar43,uVar42,local_60,iVar24,opt->blob_allocator);
              if (local_e0->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_f0) {
                  local_108 = 0;
                  do {
                    if (0 < (int)(uint)local_110) {
                      local_118 = (Option *)
                                  (local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                                  (long)local_f8[1].data);
                      pauVar34 = (undefined1 (*) [16])
                                 (local_e0->cstep * local_108 * local_e0->elemsize +
                                 (long)local_e0->data);
                      pauVar50 = (undefined1 (*) [16])
                                 (local_f8->cstep * local_108 * local_f8->elemsize +
                                 (long)local_f8->data);
                      uVar28 = 0;
                      do {
                        local_a0._0_16_ = *(undefined1 (*) [16])((long)local_118 + uVar28 * 0x10);
                        uVar26 = (ulong)local_100 & 0xffffffff;
                        if (0 < (int)local_100) {
                          do {
                            auVar91 = ZEXT856(*(ulong *)((long)*pauVar50 + 8));
                            local_c0._0_16_ = *pauVar50;
                            afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                            auVar85._0_8_ = afVar94._0_8_;
                            auVar85._8_56_ = auVar91;
                            *pauVar34 = auVar85._0_16_;
                            pauVar50 = pauVar50 + 1;
                            pauVar34 = pauVar34 + 1;
                            uVar54 = (int)uVar26 - 1;
                            uVar26 = (ulong)uVar54;
                          } while (uVar54 != 0);
                        }
                        uVar28 = uVar28 + 1;
                      } while ((__m256 *)uVar28 != local_110);
                    }
                    local_108 = local_108 + 1;
                  } while (local_108 != local_f0);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
              local_f8 = a;
              local_e8 = pMVar25;
              local_e0 = this_00;
              local_d8 = uVar28;
              local_64 = iVar5;
              Mat::create(this_00,uVar54,uVar43,uVar42,local_60,iVar24,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_f0) {
                  lVar29 = (long)local_100 << 4;
                  local_108 = 0;
                  local_118 = (Option *)lVar29;
                  do {
                    if (0 < (int)(uint)local_110) {
                      pvVar35 = (void *)(local_e0->cstep * local_108 * local_e0->elemsize +
                                        (long)local_e0->data);
                      pvVar55 = (void *)(local_f8->cstep * local_108 * local_f8->elemsize +
                                        (long)local_f8->data);
                      lVar52 = local_f8[1].elemsize * local_f8[1].cstep * local_108;
                      pvVar53 = local_f8[1].data;
                      iVar23 = 0;
                      pafVar46 = local_100;
                      do {
                        if (0 < (int)pafVar46) {
                          lVar47 = 0;
                          do {
                            local_a0._0_16_ = *(undefined1 (*) [16])((long)pvVar55 + lVar47);
                            pauVar34 = (undefined1 (*) [16])((long)pvVar53 + lVar47 + lVar52);
                            auVar91 = ZEXT856(*(ulong *)(*pauVar34 + 8));
                            local_c0._0_16_ = *pauVar34;
                            afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                            auVar86._0_8_ = afVar94._0_8_;
                            auVar86._8_56_ = auVar91;
                            *(undefined1 (*) [16])((long)pvVar35 + lVar47) = auVar86._0_16_;
                            lVar47 = lVar47 + 0x10;
                          } while (lVar29 != lVar47);
                          pvVar35 = (void *)((long)pvVar35 + lVar47);
                          pvVar55 = (void *)((long)pvVar55 + lVar47);
                          pafVar46 = local_100;
                        }
                        iVar23 = iVar23 + 1;
                      } while (iVar23 != (uint)local_110);
                    }
                    local_108 = local_108 + 1;
                  } while (local_108 != local_f0);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
              local_f8 = a;
              local_e8 = pMVar25;
              local_e0 = this_00;
              local_d8 = uVar28;
              local_64 = iVar5;
              Mat::create(this_00,uVar44,uVar4,uVar6,local_c8,iVar5,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_f0) {
                  local_108 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      local_100 = (__m256 *)
                                  (local_f8->cstep * local_108 * local_f8->elemsize +
                                  (long)local_f8->data);
                      pauVar50 = (undefined1 (*) [16])
                                 (local_e0->cstep * local_108 * local_e0->elemsize +
                                 (long)local_e0->data);
                      pauVar34 = (undefined1 (*) [16])
                                 (local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                                 (long)local_f8[1].data);
                      local_110 = (__m256 *)0x0;
                      do {
                        local_a0._0_16_ =
                             *(undefined1 (*) [16])((long)local_100 + (long)local_110 * 0x10);
                        uVar28 = (ulong)local_118 & 0xffffffff;
                        if (0 < (int)local_118) {
                          do {
                            auVar91 = ZEXT856(*(ulong *)((long)*pauVar34 + 8));
                            local_c0._0_16_ = *pauVar34;
                            afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                            auVar87._0_8_ = afVar94._0_8_;
                            auVar87._8_56_ = auVar91;
                            *pauVar50 = auVar87._0_16_;
                            pauVar34 = pauVar34 + 1;
                            pauVar50 = pauVar50 + 1;
                            uVar54 = (int)uVar28 - 1;
                            uVar28 = (ulong)uVar54;
                          } while (uVar54 != 0);
                        }
                        local_110 = (__m256 *)((long)local_110 + 1);
                      } while (local_110 != (__m256 *)(ulong)uVar4);
                    }
                    local_108 = local_108 + 1;
                  } while (local_108 != local_f0);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d8 = uVar28;
            local_64 = iVar5;
            if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
              Mat::create(this_00,uVar44,uVar4,uVar6,local_c8,iVar5,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_e0->c * local_e0->cstep != 0) {
                if (0 < (int)local_f0) {
                  lVar29 = (long)local_118 << 4;
                  local_e8 = (Mat *)0x0;
                  local_108 = lVar29;
                  do {
                    if (0 < (int)uVar4) {
                      pvVar35 = (void *)(local_e0->cstep * (long)local_e8 * local_e0->elemsize +
                                        (long)local_e0->data);
                      pvVar53 = (void *)(local_f8[1].cstep * (long)local_e8 * local_f8[1].elemsize +
                                        (long)local_f8[1].data);
                      local_100 = (__m256 *)
                                  (local_f8->elemsize * local_f8->cstep * (long)local_e8 +
                                  (long)local_f8->data);
                      uVar54 = 0;
                      do {
                        pafVar46 = local_100;
                        if (0 < (int)local_118) {
                          local_110 = (__m256 *)CONCAT44(local_110._4_4_,uVar54);
                          lVar52 = 0;
                          do {
                            local_a0._0_16_ = *(undefined1 (*) [16])((long)pafVar46 + lVar52);
                            auVar91 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])
                                                          ((long)pvVar53 + lVar52) + 8));
                            local_c0._0_16_ = *(undefined1 (*) [16])((long)pvVar53 + lVar52);
                            afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                (&local_119,(__m128 *)local_a0,(__m128 *)local_c0);
                            auVar88._0_8_ = afVar94._0_8_;
                            auVar88._8_56_ = auVar91;
                            *(undefined1 (*) [16])((long)pvVar35 + lVar52) = auVar88._0_16_;
                            lVar52 = lVar52 + 0x10;
                          } while (lVar29 != lVar52);
                          pvVar35 = (void *)((long)pvVar35 + lVar52);
                          pvVar53 = (void *)((long)pvVar53 + lVar52);
                          uVar54 = (uint)local_110;
                        }
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    local_e8 = (Mat *)((long)local_e8 + 1);
                  } while (local_e8 != (Mat *)local_f0);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            goto LAB_0040ef48;
          }
          if (a[1].dims == 4) {
            local_f8 = a;
            local_e0 = this_00;
            Mat::create(this_00,uVar44,uVar4,iVar3,uVar6,local_c8,iVar5,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_d8 = 0;
                do {
                  if (0 < (int)local_108) {
                    pauVar34 = (undefined1 (*) [16])
                               (local_e0->cstep * local_d8 * local_e0->elemsize +
                               (long)local_e0->data);
                    pauVar50 = (undefined1 (*) [16])
                               (local_f8[1].cstep * local_d8 * local_f8[1].elemsize +
                               (long)local_f8[1].data);
                    local_110 = (__m256 *)
                                (local_f8->cstep * local_d8 * local_f8->elemsize +
                                (long)local_f8->data);
                    iVar23 = 0;
                    do {
                      local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                      if (0 < (int)uVar4) {
                        uVar54 = 0;
                        do {
                          local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar54);
                          local_a0._0_16_ = *(undefined1 (*) [16])local_110;
                          uVar28 = (ulong)local_118 & 0xffffffff;
                          if (0 < (int)local_118) {
                            do {
                              auVar91 = ZEXT856(*(ulong *)((long)*pauVar50 + 8));
                              local_c0._0_16_ = *pauVar50;
                              afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                  (&local_119,(__m128 *)local_a0,(__m128 *)local_c0)
                              ;
                              auVar77._0_8_ = afVar94._0_8_;
                              auVar77._8_56_ = auVar91;
                              *pauVar34 = auVar77._0_16_;
                              pauVar50 = pauVar50 + 1;
                              pauVar34 = pauVar34 + 1;
                              uVar54 = (int)uVar28 - 1;
                              uVar28 = (ulong)uVar54;
                            } while (uVar54 != 0);
                          }
                          local_110 = (__m256 *)((long)local_110 + 0x10);
                          uVar54 = (int)local_100 + 1;
                        } while (uVar54 != uVar4);
                      }
                      iVar23 = (int)local_e8 + 1;
                    } while (iVar23 != (int)local_108);
                  }
                  local_d8 = local_d8 + 1;
                } while (local_d8 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          local_e0 = this_00;
          local_d8 = uVar28;
          Mat::create(this_00,uVar54,uVar43,uVar42,local_60,iVar24,opt->blob_allocator);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep == 0) {
            return -100;
          }
          if (local_f8[1].dims == 1) {
            this_00 = local_e0;
            if (iVar5 != 1 || local_f8[1].w != 1) {
              if (0 < (int)local_d8) {
                local_110 = (__m256 *)0x0;
                do {
                  pvVar53 = local_f8->data;
                  local_a0._0_16_ =
                       *(undefined1 (*) [16])((long)local_f8[1].data + (long)local_110 * 0x10);
                  if (0 < (int)local_e8) {
                    local_118 = (Option *)
                                (local_e0->cstep * local_e0->elemsize * (long)local_110 +
                                (long)local_e0->data);
                    lVar29 = local_f8->cstep * local_f8->elemsize * (long)local_110;
                    lVar52 = 0;
                    iVar23 = (int)local_e8;
                    do {
                      pauVar34 = (undefined1 (*) [16])((long)pvVar53 + lVar52 + lVar29);
                      uVar90 = *(undefined8 *)(*pauVar34 + 8);
                      local_c0._0_16_ = *pauVar34;
                      afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                          (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                      *(undefined8 *)((long)local_118 + lVar52) = afVar94._0_8_;
                      ((undefined8 *)((long)local_118 + lVar52))[1] = uVar90;
                      lVar52 = lVar52 + 0x10;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 1);
                } while (local_110 != (__m256 *)local_d8);
                return 0;
              }
              return 0;
            }
            goto LAB_00418053;
          }
          if (local_f8[1].dims == 2) {
            if (0 < (int)local_d8) {
              local_108 = 0;
              do {
                if (0 < (int)(uint)local_110) {
                  pauVar51 = (undefined1 (*) [16])
                             (local_e0->cstep * local_108 * local_e0->elemsize +
                             (long)local_e0->data);
                  pauVar34 = (undefined1 (*) [16])
                             ((long)local_f8[1].w * local_108 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8->cstep * local_108 * local_f8->elemsize +
                             (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    local_118 = (Option *)CONCAT44(local_118._4_4_,iVar23);
                    local_a0._0_16_ = *pauVar34;
                    uVar28 = (ulong)local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        auVar91 = ZEXT856(*(ulong *)((long)*pauVar50 + 8));
                        local_c0._0_16_ = *pauVar50;
                        afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                            (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                        auVar81._0_8_ = afVar94._0_8_;
                        auVar81._8_56_ = auVar91;
                        *pauVar51 = auVar81._0_16_;
                        pauVar50 = pauVar50 + 1;
                        pauVar51 = pauVar51 + 1;
                        uVar54 = (int)uVar28 - 1;
                        uVar28 = (ulong)uVar54;
                      } while (uVar54 != 0);
                    }
                    pauVar34 = pauVar34 + 1;
                    iVar23 = (int)local_118 + 1;
                  } while (iVar23 != (uint)local_110);
                }
                local_108 = local_108 + 1;
              } while (local_108 != local_d8);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          local_108 = CONCAT44(local_108._4_4_,iVar23);
          if (a[1].dims == 4) goto LAB_0040ef48;
          local_f8 = a;
          local_e0 = this_00;
          local_d8 = uVar28;
          Mat::create(this_00,uVar54,uVar43,iVar23,uVar42,local_60,iVar24,opt->blob_allocator);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep == 0) {
            return -100;
          }
          iVar23 = local_f8[1].dims;
          if (iVar23 == 1) {
            this_00 = local_e0;
            if (iVar5 != 1 || local_f8[1].w != 1) {
              if (0 < (int)local_d8) {
                local_110 = (__m256 *)0x0;
                do {
                  pvVar53 = local_f8->data;
                  local_a0._0_16_ =
                       *(undefined1 (*) [16])((long)local_f8[1].data + (long)local_110 * 0x10);
                  if (0 < (int)local_e8) {
                    lVar29 = local_f8->cstep * local_f8->elemsize * (long)local_110;
                    local_118 = (Option *)
                                (local_e0->cstep * local_e0->elemsize * (long)local_110 +
                                (long)local_e0->data);
                    lVar52 = 0;
                    iVar23 = (int)local_e8;
                    do {
                      pauVar34 = (undefined1 (*) [16])((long)pvVar53 + lVar52 + lVar29);
                      uVar90 = *(undefined8 *)(*pauVar34 + 8);
                      local_c0._0_16_ = *pauVar34;
                      afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                          (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                      *(undefined8 *)((long)local_118 + lVar52) = afVar94._0_8_;
                      ((undefined8 *)((long)local_118 + lVar52))[1] = uVar90;
                      lVar52 = lVar52 + 0x10;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 1);
                } while (local_110 != (__m256 *)local_d8);
                return 0;
              }
              return 0;
            }
            goto LAB_00418053;
          }
          if (iVar23 == 3) {
            if (0 < (int)local_d8) {
              local_f0 = 0;
              do {
                if (0 < (int)local_108) {
                  pauVar51 = (undefined1 (*) [16])
                             (local_e0->cstep * local_f0 * local_e0->elemsize + (long)local_e0->data
                             );
                  pauVar50 = (undefined1 (*) [16])
                             (local_f8[1].cstep * local_f0 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar34 = (undefined1 (*) [16])
                             (local_f8->cstep * local_f0 * local_f8->elemsize + (long)local_f8->data
                             );
                  iVar23 = 0;
                  pafVar46 = local_110;
                  do {
                    local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                    if (0 < (int)pafVar46) {
                      iVar23 = 0;
                      do {
                        local_118 = (Option *)CONCAT44(local_118._4_4_,iVar23);
                        local_a0._0_16_ = *pauVar50;
                        uVar28 = (ulong)local_100 & 0xffffffff;
                        if (0 < (int)local_100) {
                          do {
                            auVar91 = ZEXT856(*(ulong *)((long)*pauVar34 + 8));
                            local_c0._0_16_ = *pauVar34;
                            afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                            auVar84._0_8_ = afVar94._0_8_;
                            auVar84._8_56_ = auVar91;
                            *pauVar51 = auVar84._0_16_;
                            pauVar34 = pauVar34 + 1;
                            pauVar51 = pauVar51 + 1;
                            uVar54 = (int)uVar28 - 1;
                            uVar28 = (ulong)uVar54;
                          } while (uVar54 != 0);
                        }
                        pauVar50 = pauVar50 + 1;
                        iVar23 = (int)local_118 + 1;
                        pafVar46 = local_110;
                      } while (iVar23 != (int)local_110);
                    }
                    iVar23 = (int)local_e8 + 1;
                  } while (iVar23 != (int)local_108);
                }
                local_f0 = local_f0 + 1;
              } while (local_f0 != local_d8);
              return 0;
            }
            return 0;
          }
          if (iVar23 == 2) {
            if (0 < (int)local_d8) {
              local_f0 = 0;
              do {
                if (0 < (int)local_108) {
                  pauVar50 = (undefined1 (*) [16])
                             (local_e0->cstep * local_f0 * local_e0->elemsize + (long)local_e0->data
                             );
                  local_118 = (Option *)
                              ((long)local_f8[1].w * local_f0 * local_f8[1].elemsize +
                              (long)local_f8[1].data);
                  pauVar34 = (undefined1 (*) [16])
                             (local_f8->cstep * local_f0 * local_f8->elemsize + (long)local_f8->data
                             );
                  iVar23 = 0;
                  pafVar46 = local_110;
                  do {
                    local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                    local_a0._0_16_ = local_118->lightmode;
                    if (0 < (int)pafVar46) {
                      iVar23 = 0;
                      do {
                        uVar28 = (ulong)local_100 & 0xffffffff;
                        if (0 < (int)local_100) {
                          do {
                            auVar91 = ZEXT856(*(ulong *)((long)*pauVar34 + 8));
                            local_c0._0_16_ = *pauVar34;
                            afVar94 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                                (&local_119,(__m128 *)local_c0,(__m128 *)local_a0);
                            auVar79._0_8_ = afVar94._0_8_;
                            auVar79._8_56_ = auVar91;
                            *pauVar50 = auVar79._0_16_;
                            pauVar34 = pauVar34 + 1;
                            pauVar50 = pauVar50 + 1;
                            uVar54 = (int)uVar28 - 1;
                            uVar28 = (ulong)uVar54;
                          } while (uVar54 != 0);
                        }
                        iVar23 = iVar23 + 1;
                        pafVar46 = local_110;
                      } while (iVar23 != (int)local_110);
                    }
                    local_118 = (Option *)((long)local_118 + 0x10);
                    iVar23 = (int)local_e8 + 1;
                  } while (iVar23 != (int)local_108);
                }
                local_f0 = local_f0 + 1;
              } while (local_f0 != local_d8);
              return 0;
            }
            return 0;
          }
        }
      }
      return 0;
    case 7:
      pMVar37 = a;
      a = pMVar25;
      break;
    case 8:
      pMVar37 = a;
      a = pMVar25;
LAB_0040d784:
      iVar23 = binary_op_pack4<ncnn::BinaryOp_x86_avx_functor::binary_op_div>(a,pMVar37,this_00,opt)
      ;
      return iVar23;
    default:
      goto switchD_0040d05b_default;
    }
    iVar23 = binary_op_pack4<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>(a,pMVar37,this_00,opt);
    return iVar23;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
    uVar54 = a->w;
    uVar43 = a->h;
    iVar3 = a->d;
    uVar42 = a->c;
    local_108 = (ulong)uVar42;
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
    sVar27 = a->elemsize;
    uVar44 = a[1].w;
    uVar4 = a[1].h;
    iVar5 = a[1].d;
    uVar6 = a[1].c;
    pMVar37 = (Mat *)(ulong)uVar6;
    iVar40 = uVar4 * uVar44 * iVar5;
    sVar7 = a[1].elemsize;
    local_f0 = sVar27;
    switch(a->dims) {
    case 1:
      if (iVar23 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_0040f6ee_caseD_1;
        case 2:
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pfVar32 = (float *)this_00->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar31 = (undefined1 (*) [32])a->data;
              pfVar39 = (float *)a[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar71 = *pauVar31;
                  uVar43 = uVar44;
                  do {
                    fVar2 = pfVar39[1];
                    fVar16 = pfVar39[2];
                    fVar17 = pfVar39[3];
                    fVar18 = pfVar39[4];
                    fVar19 = pfVar39[5];
                    fVar20 = pfVar39[6];
                    fVar21 = pfVar39[7];
                    *pfVar32 = auVar71._0_4_ + *pfVar39;
                    pfVar32[1] = auVar71._4_4_ + fVar2;
                    pfVar32[2] = auVar71._8_4_ + fVar16;
                    pfVar32[3] = auVar71._12_4_ + fVar17;
                    pfVar32[4] = auVar71._16_4_ + fVar18;
                    pfVar32[5] = auVar71._20_4_ + fVar19;
                    pfVar32[6] = auVar71._24_4_ + fVar20;
                    pfVar32[7] = auVar71._28_4_ + fVar21;
                    pfVar39 = pfVar39 + 8;
                    pfVar32 = pfVar32 + 8;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar31 = pauVar31 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * (long)pMVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                    *pfVar39 = auVar71._0_4_ + *pfVar32;
                    pfVar39[1] = auVar71._4_4_ + fVar2;
                    pfVar39[2] = auVar71._8_4_ + fVar16;
                    pfVar39[3] = auVar71._12_4_ + fVar17;
                    pfVar39[4] = auVar71._16_4_ + fVar18;
                    pfVar39[5] = auVar71._20_4_ + fVar19;
                    pfVar39[6] = auVar71._24_4_ + fVar20;
                    pfVar39[7] = auVar71._28_4_ + fVar21;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * (long)pMVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    fVar21 = pfVar32[7];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                    *pfVar39 = auVar71._0_4_ + *pfVar32;
                    pfVar39[1] = auVar71._4_4_ + fVar2;
                    pfVar39[2] = auVar71._8_4_ + fVar16;
                    pfVar39[3] = auVar71._12_4_ + fVar17;
                    pfVar39[4] = auVar71._16_4_ + fVar18;
                    pfVar39[5] = auVar71._20_4_ + fVar19;
                    pfVar39[6] = auVar71._24_4_ + fVar20;
                    pfVar39[7] = auVar71._28_4_ + fVar21;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_0040d0fc;
    case 2:
      pAVar8 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(a[1].cstep * (long)pMVar25 * a[1].elemsize + (long)a[1].data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)a->w * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *pauVar31;
                    uVar43 = uVar44;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      fVar21 = pfVar39[7];
                      *pfVar32 = auVar71._0_4_ + *pfVar39;
                      pfVar32[1] = auVar71._4_4_ + fVar2;
                      pfVar32[2] = auVar71._8_4_ + fVar16;
                      pfVar32[3] = auVar71._12_4_ + fVar17;
                      pfVar32[4] = auVar71._16_4_ + fVar18;
                      pfVar32[5] = auVar71._20_4_ + fVar19;
                      pfVar32[6] = auVar71._24_4_ + fVar20;
                      pfVar32[7] = auVar71._28_4_ + fVar21;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar31 = pauVar31 + 1;
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar5) {
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                   (long)local_f8[1].data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)local_f8->w * (long)pMVar25 * local_f8->elemsize +
                           (long)local_f8->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar4) {
                    auVar71 = *pauVar31;
                    uVar54 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          fVar2 = pfVar39[1];
                          fVar16 = pfVar39[2];
                          fVar17 = pfVar39[3];
                          fVar18 = pfVar39[4];
                          fVar19 = pfVar39[5];
                          fVar20 = pfVar39[6];
                          fVar21 = pfVar39[7];
                          *pfVar32 = auVar71._0_4_ + *pfVar39;
                          pfVar32[1] = auVar71._4_4_ + fVar2;
                          pfVar32[2] = auVar71._8_4_ + fVar16;
                          pfVar32[3] = auVar71._12_4_ + fVar17;
                          pfVar32[4] = auVar71._16_4_ + fVar18;
                          pfVar32[5] = auVar71._20_4_ + fVar19;
                          pfVar32[6] = auVar71._24_4_ + fVar20;
                          pfVar32[7] = auVar71._28_4_ + fVar21;
                          pfVar39 = pfVar39 + 8;
                          pfVar32 = pfVar32 + 8;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar54 = uVar54 + 1;
                    } while (uVar54 != uVar4);
                  }
                  pauVar31 = pauVar31 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar5);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f8 = a;
      Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar24 = local_f8[1].dims;
      if (iVar24 == 1) {
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
        pfVar32 = (float *)this_00->data;
        if (pfVar32 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)uVar43) {
            pfVar39 = (float *)local_f8->data;
            pauVar31 = (undefined1 (*) [32])local_f8[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar71 = *pauVar31;
                uVar44 = uVar54;
                do {
                  fVar2 = pfVar39[1];
                  fVar16 = pfVar39[2];
                  fVar17 = pfVar39[3];
                  fVar18 = pfVar39[4];
                  fVar19 = pfVar39[5];
                  fVar20 = pfVar39[6];
                  fVar21 = pfVar39[7];
                  *pfVar32 = auVar71._0_4_ + *pfVar39;
                  pfVar32[1] = auVar71._4_4_ + fVar2;
                  pfVar32[2] = auVar71._8_4_ + fVar16;
                  pfVar32[3] = auVar71._12_4_ + fVar17;
                  pfVar32[4] = auVar71._16_4_ + fVar18;
                  pfVar32[5] = auVar71._20_4_ + fVar19;
                  pfVar32[6] = auVar71._24_4_ + fVar20;
                  pfVar32[7] = auVar71._28_4_ + fVar21;
                  pfVar39 = pfVar39 + 8;
                  pfVar32 = pfVar32 + 8;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar31 = pauVar31 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_00418026;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar5) {
                  pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                     (long)local_f8[1].data);
                  pauVar31 = (undefined1 (*) [32])
                             (local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                             (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar54 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar71 = *pauVar31;
                          uVar43 = uVar44;
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            fVar18 = pfVar39[4];
                            fVar19 = pfVar39[5];
                            fVar20 = pfVar39[6];
                            fVar21 = pfVar39[7];
                            *pfVar32 = auVar71._0_4_ + *pfVar39;
                            pfVar32[1] = auVar71._4_4_ + fVar2;
                            pfVar32[2] = auVar71._8_4_ + fVar16;
                            pfVar32[3] = auVar71._12_4_ + fVar17;
                            pfVar32[4] = auVar71._16_4_ + fVar18;
                            pfVar32[5] = auVar71._20_4_ + fVar19;
                            pfVar32[6] = auVar71._24_4_ + fVar20;
                            pfVar32[7] = auVar71._28_4_ + fVar21;
                            pfVar39 = pfVar39 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar31 = pauVar31 + 1;
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_f8[1].dims != 1) {
          if (local_f8[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_108) {
            sVar27 = 0;
            do {
              if (0 < (int)uVar43) {
                pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)local_f8[1].w * sVar27 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pfVar39 = (float *)(local_f8->cstep * sVar27 * local_f8->elemsize +
                                   (long)local_f8->data);
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *pauVar31;
                    uVar44 = uVar54;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      fVar21 = pfVar39[7];
                      *pfVar32 = auVar71._0_4_ + *pfVar39;
                      pfVar32[1] = auVar71._4_4_ + fVar2;
                      pfVar32[2] = auVar71._8_4_ + fVar16;
                      pfVar32[3] = auVar71._12_4_ + fVar17;
                      pfVar32[4] = auVar71._16_4_ + fVar18;
                      pfVar32[5] = auVar71._20_4_ + fVar19;
                      pfVar32[6] = auVar71._24_4_ + fVar20;
                      pfVar32[7] = auVar71._28_4_ + fVar21;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar31 = pauVar31 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)local_108) {
            sVar27 = 0;
            do {
              if (0 < (int)local_100) {
                sVar7 = this_00->cstep;
                sVar10 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)pMVar25->data + sVar27 * 0x20);
                pvVar53 = this_00->data;
                sVar11 = local_f8->cstep;
                sVar9 = local_f8->elemsize;
                pvVar35 = local_f8->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  fVar21 = pfVar32[7];
                  pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27);
                  *pfVar39 = auVar71._0_4_ + *pfVar32;
                  pfVar39[1] = auVar71._4_4_ + fVar2;
                  pfVar39[2] = auVar71._8_4_ + fVar16;
                  pfVar39[3] = auVar71._12_4_ + fVar17;
                  pfVar39[4] = auVar71._16_4_ + fVar18;
                  pfVar39[5] = auVar71._20_4_ + fVar19;
                  pfVar39[6] = auVar71._24_4_ + fVar20;
                  pfVar39[7] = auVar71._28_4_ + fVar21;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_00418026;
      }
      if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                pvVar53 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar35 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  fVar21 = pfVar32[7];
                  pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                  *pfVar39 = auVar71._0_4_ + *pfVar32;
                  pfVar39[1] = auVar71._4_4_ + fVar2;
                  pfVar39[2] = auVar71._8_4_ + fVar16;
                  pfVar39[3] = auVar71._12_4_ + fVar17;
                  pfVar39[4] = auVar71._16_4_ + fVar18;
                  pfVar39[5] = auVar71._20_4_ + fVar19;
                  pfVar39[6] = auVar71._24_4_ + fVar20;
                  pfVar39[7] = auVar71._28_4_ + fVar21;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                sVar10 = a->cstep;
                pvVar53 = this_00->data;
                pvVar35 = a[1].data;
                sVar11 = a->elemsize;
                pvVar55 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  fVar2 = *(float *)((long)pvVar35 + lVar29);
                  pfVar32 = (float *)((long)pvVar55 + lVar29 * 8 + sVar10 * sVar11 * uVar28);
                  auVar70._0_4_ = fVar2 + *pfVar32;
                  auVar70._4_4_ = fVar2 + pfVar32[1];
                  auVar70._8_4_ = fVar2 + pfVar32[2];
                  auVar70._12_4_ = fVar2 + pfVar32[3];
                  auVar70._16_4_ = fVar2 + pfVar32[4];
                  auVar70._20_4_ = fVar2 + pfVar32[5];
                  auVar70._24_4_ = fVar2 + pfVar32[6];
                  auVar70._28_4_ = fVar2 + pfVar32[7];
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 * 8 + sVar27 * sVar7 * uVar28) =
                       auVar70;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = (__m256 *)sVar7;
      if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a->data + a->cstep * (long)pMVar25 * a->elemsize);
                pvVar53 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * (long)pMVar25);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  fVar21 = pfVar32[7];
                  pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                  *pfVar39 = auVar71._0_4_ + *pfVar32;
                  pfVar39[1] = auVar71._4_4_ + fVar2;
                  pfVar39[2] = auVar71._8_4_ + fVar16;
                  pfVar39[3] = auVar71._12_4_ + fVar17;
                  pfVar39[4] = auVar71._16_4_ + fVar18;
                  pfVar39[5] = auVar71._20_4_ + fVar19;
                  pfVar39[6] = auVar71._24_4_ + fVar20;
                  pfVar39[7] = auVar71._28_4_ + fVar21;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 == uVar54) && (iVar23 == 1)) && (uVar4 == uVar43)) && (uVar42 == 1)) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar53 = a->data;
                pvVar35 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  fVar2 = *(float *)((long)pvVar53 + lVar29);
                  pfVar32 = (float *)((long)pvVar55 + lVar29 * 8 + sVar10 * sVar11 * (long)pMVar25);
                  auVar73._0_4_ = fVar2 + *pfVar32;
                  auVar73._4_4_ = fVar2 + pfVar32[1];
                  auVar73._8_4_ = fVar2 + pfVar32[2];
                  auVar73._12_4_ = fVar2 + pfVar32[3];
                  auVar73._16_4_ = fVar2 + pfVar32[4];
                  auVar73._20_4_ = fVar2 + pfVar32[5];
                  auVar73._24_4_ = fVar2 + pfVar32[6];
                  auVar73._28_4_ = fVar2 + pfVar32[7];
                  *(undefined1 (*) [32])
                   ((long)pvVar35 + lVar29 * 8 + sVar27 * sVar7 * (long)pMVar25) = auVar73;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = a[1].cstep;
                sVar7 = a[1].elemsize;
                pvVar53 = a[1].data;
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(a->cstep * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar42 = uVar54;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      fVar21 = pfVar39[7];
                      *pfVar32 = auVar71._0_4_ + *pfVar39;
                      pfVar32[1] = auVar71._4_4_ + fVar2;
                      pfVar32[2] = auVar71._8_4_ + fVar16;
                      pfVar32[3] = auVar71._12_4_ + fVar17;
                      pfVar32[4] = auVar71._16_4_ + fVar18;
                      pfVar32[5] = auVar71._20_4_ + fVar19;
                      pfVar32[6] = auVar71._24_4_ + fVar20;
                      pfVar32[7] = auVar71._28_4_ + fVar21;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = pMVar37;
      if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = local_f8[1].elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                                  (long)local_f8->data);
                sVar7 = local_f8[1].cstep;
                pvVar53 = local_f8[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar29 = 0;
                    do {
                      pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                      pfVar39 = (float *)((long)pvVar55 + lVar29);
                      auVar75._0_4_ = *pfVar32 + *pfVar39;
                      auVar75._4_4_ = pfVar32[1] + pfVar39[1];
                      auVar75._8_4_ = pfVar32[2] + pfVar39[2];
                      auVar75._12_4_ = pfVar32[3] + pfVar39[3];
                      auVar75._16_4_ = pfVar32[4] + pfVar39[4];
                      auVar75._20_4_ = pfVar32[5] + pfVar39[5];
                      auVar75._24_4_ = pfVar32[6] + pfVar39[6];
                      auVar75._28_4_ = pfVar32[7] + pfVar39[7];
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar75;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar54 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->cstep;
                sVar7 = local_f8->elemsize;
                pvVar53 = local_f8->data;
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                   (long)local_f8[1].data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar54 = uVar44;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      fVar21 = pfVar39[7];
                      *pfVar32 = auVar71._0_4_ + *pfVar39;
                      pfVar32[1] = auVar71._4_4_ + fVar2;
                      pfVar32[2] = auVar71._8_4_ + fVar16;
                      pfVar32[3] = auVar71._12_4_ + fVar17;
                      pfVar32[4] = auVar71._16_4_ + fVar18;
                      pfVar32[5] = auVar71._20_4_ + fVar19;
                      pfVar32[6] = auVar71._24_4_ + fVar20;
                      pfVar32[7] = auVar71._28_4_ + fVar21;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar54 = uVar54 - 1;
                    } while (uVar54 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                  (long)local_f8[1].data);
                sVar7 = local_f8->cstep;
                pvVar53 = local_f8->data;
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar29 = 0;
                    do {
                      pfVar32 = (float *)((long)pvVar55 + lVar29);
                      pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                      auVar76._0_4_ = *pfVar32 + *pfVar39;
                      auVar76._4_4_ = pfVar32[1] + pfVar39[1];
                      auVar76._8_4_ = pfVar32[2] + pfVar39[2];
                      auVar76._12_4_ = pfVar32[3] + pfVar39[3];
                      auVar76._16_4_ = pfVar32[4] + pfVar39[4];
                      auVar76._20_4_ = pfVar32[5] + pfVar39[5];
                      auVar76._24_4_ = pfVar32[6] + pfVar39[6];
                      auVar76._28_4_ = pfVar32[7] + pfVar39[7];
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar76;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar44 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_0041acd9:
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      local_f8 = a;
      goto LAB_0040eb34;
    case 4:
      if (a[1].dims != 4) {
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar23 = a[1].dims;
        iVar24 = (int)local_108;
        if (iVar23 != 1) {
          if (iVar23 == 3) {
            if (0 < iVar24) {
              sVar27 = 0;
              do {
                if (0 < iVar3) {
                  pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar31 = (undefined1 (*) [32])
                             (a[1].cstep * sVar27 * a[1].elemsize + (long)a[1].data);
                  pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar54) {
                          auVar71 = *pauVar31;
                          uVar44 = uVar54;
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            fVar18 = pfVar39[4];
                            fVar19 = pfVar39[5];
                            fVar20 = pfVar39[6];
                            fVar21 = pfVar39[7];
                            *pfVar32 = auVar71._0_4_ + *pfVar39;
                            pfVar32[1] = auVar71._4_4_ + fVar2;
                            pfVar32[2] = auVar71._8_4_ + fVar16;
                            pfVar32[3] = auVar71._12_4_ + fVar17;
                            pfVar32[4] = auVar71._16_4_ + fVar18;
                            pfVar32[5] = auVar71._20_4_ + fVar19;
                            pfVar32[6] = auVar71._24_4_ + fVar20;
                            pfVar32[7] = auVar71._28_4_ + fVar21;
                            pfVar39 = pfVar39 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar31 = pauVar31 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_108);
              return 0;
            }
            return 0;
          }
          if (iVar23 != 2) {
            return 0;
          }
          if (0 < iVar24) {
            sVar27 = 0;
            do {
              if (0 < iVar3) {
                pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)a[1].w * sVar27 * a[1].elemsize + (long)a[1].data);
                pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar71 = *pauVar31;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          fVar2 = pfVar39[1];
                          fVar16 = pfVar39[2];
                          fVar17 = pfVar39[3];
                          fVar18 = pfVar39[4];
                          fVar19 = pfVar39[5];
                          fVar20 = pfVar39[6];
                          fVar21 = pfVar39[7];
                          *pfVar32 = auVar71._0_4_ + *pfVar39;
                          pfVar32[1] = auVar71._4_4_ + fVar2;
                          pfVar32[2] = auVar71._8_4_ + fVar16;
                          pfVar32[3] = auVar71._12_4_ + fVar17;
                          pfVar32[4] = auVar71._16_4_ + fVar18;
                          pfVar32[5] = auVar71._20_4_ + fVar19;
                          pfVar32[6] = auVar71._24_4_ + fVar20;
                          pfVar32[7] = auVar71._28_4_ + fVar21;
                          pfVar39 = pfVar39 + 8;
                          pfVar32 = pfVar32 + 8;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar31 = pauVar31 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar3);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        pMVar25 = local_e8;
        if ((uint)local_110 != 1 || a[1].w != 1) {
          if (0 < iVar24) {
            sVar27 = 0;
            do {
              if (0 < (int)local_100) {
                sVar7 = a->cstep;
                sVar10 = a->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)local_e8->data + sVar27 * 0x20);
                pvVar53 = a->data;
                sVar11 = this_00->cstep;
                sVar9 = this_00->elemsize;
                pvVar35 = this_00->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  fVar21 = pfVar32[7];
                  pfVar39 = (float *)((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27);
                  *pfVar39 = auVar71._0_4_ + *pfVar32;
                  pfVar39[1] = auVar71._4_4_ + fVar2;
                  pfVar39[2] = auVar71._8_4_ + fVar16;
                  pfVar39[3] = auVar71._12_4_ + fVar17;
                  pfVar39[4] = auVar71._16_4_ + fVar18;
                  pfVar39[5] = auVar71._20_4_ + fVar19;
                  pfVar39[6] = auVar71._24_4_ + fVar20;
                  pfVar39[7] = auVar71._28_4_ + fVar21;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_00418026;
      }
      goto LAB_0040eb34;
    }
LAB_004126a5:
    a = local_f8;
    if (iVar24 != 2) {
      return 0;
    }
LAB_0040eb34:
    iVar23 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                       (a,pMVar25,this_00,local_118);
    return iVar23;
  case 1:
    pMVar37 = pMVar25;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
    uVar54 = a->w;
    uVar43 = a->h;
    iVar3 = a->d;
    uVar42 = a->c;
    local_108 = (ulong)uVar42;
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
    sVar27 = a->elemsize;
    uVar44 = a[1].w;
    uVar4 = a[1].h;
    iVar5 = a[1].d;
    uVar6 = a[1].c;
    pMVar37 = (Mat *)(ulong)uVar6;
    iVar40 = uVar4 * uVar44 * iVar5;
    sVar7 = a[1].elemsize;
    local_f0 = sVar27;
    switch(a->dims) {
    case 1:
      if (iVar23 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_0040f526_caseD_1;
        case 2:
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pfVar32 = (float *)this_00->data;
          if (pfVar32 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar31 = (undefined1 (*) [32])a->data;
              pfVar39 = (float *)a[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar71 = *pauVar31;
                  uVar43 = uVar44;
                  do {
                    fVar2 = pfVar39[1];
                    fVar16 = pfVar39[2];
                    fVar17 = pfVar39[3];
                    fVar18 = pfVar39[4];
                    fVar19 = pfVar39[5];
                    fVar20 = pfVar39[6];
                    *pfVar32 = auVar71._0_4_ * *pfVar39;
                    pfVar32[1] = auVar71._4_4_ * fVar2;
                    pfVar32[2] = auVar71._8_4_ * fVar16;
                    pfVar32[3] = auVar71._12_4_ * fVar17;
                    pfVar32[4] = auVar71._16_4_ * fVar18;
                    pfVar32[5] = auVar71._20_4_ * fVar19;
                    pfVar32[6] = auVar71._24_4_ * fVar20;
                    pfVar32[7] = in_register_0000125c;
                    pfVar39 = pfVar39 + 8;
                    pfVar32 = pfVar32 + 8;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar31 = pauVar31 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * (long)pMVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                    *pfVar39 = auVar71._0_4_ * *pfVar32;
                    pfVar39[1] = auVar71._4_4_ * fVar2;
                    pfVar39[2] = auVar71._8_4_ * fVar16;
                    pfVar39[3] = auVar71._12_4_ * fVar17;
                    pfVar39[4] = auVar71._16_4_ * fVar18;
                    pfVar39[5] = auVar71._20_4_ * fVar19;
                    pfVar39[6] = auVar71._24_4_ * fVar20;
                    pfVar39[7] = in_register_0000125c;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * (long)pMVar25);
                    fVar2 = pfVar32[1];
                    fVar16 = pfVar32[2];
                    fVar17 = pfVar32[3];
                    fVar18 = pfVar32[4];
                    fVar19 = pfVar32[5];
                    fVar20 = pfVar32[6];
                    pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                    *pfVar39 = auVar71._0_4_ * *pfVar32;
                    pfVar39[1] = auVar71._4_4_ * fVar2;
                    pfVar39[2] = auVar71._8_4_ * fVar16;
                    pfVar39[3] = auVar71._12_4_ * fVar17;
                    pfVar39[4] = auVar71._16_4_ * fVar18;
                    pfVar39[5] = auVar71._20_4_ * fVar19;
                    pfVar39[6] = auVar71._24_4_ * fVar20;
                    pfVar39[7] = in_register_0000125c;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_0040d5d4;
    case 2:
      pAVar8 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(a[1].cstep * (long)pMVar25 * a[1].elemsize + (long)a[1].data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)a->w * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *pauVar31;
                    uVar43 = uVar44;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      *pfVar32 = auVar71._0_4_ * *pfVar39;
                      pfVar32[1] = auVar71._4_4_ * fVar2;
                      pfVar32[2] = auVar71._8_4_ * fVar16;
                      pfVar32[3] = auVar71._12_4_ * fVar17;
                      pfVar32[4] = auVar71._16_4_ * fVar18;
                      pfVar32[5] = auVar71._20_4_ * fVar19;
                      pfVar32[6] = auVar71._24_4_ * fVar20;
                      pfVar32[7] = in_register_0000125c;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar31 = pauVar31 + 1;
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar5) {
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                   (long)local_f8[1].data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)local_f8->w * (long)pMVar25 * local_f8->elemsize +
                           (long)local_f8->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar4) {
                    auVar71 = *pauVar31;
                    uVar54 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          fVar2 = pfVar39[1];
                          fVar16 = pfVar39[2];
                          fVar17 = pfVar39[3];
                          fVar18 = pfVar39[4];
                          fVar19 = pfVar39[5];
                          fVar20 = pfVar39[6];
                          *pfVar32 = auVar71._0_4_ * *pfVar39;
                          pfVar32[1] = auVar71._4_4_ * fVar2;
                          pfVar32[2] = auVar71._8_4_ * fVar16;
                          pfVar32[3] = auVar71._12_4_ * fVar17;
                          pfVar32[4] = auVar71._16_4_ * fVar18;
                          pfVar32[5] = auVar71._20_4_ * fVar19;
                          pfVar32[6] = auVar71._24_4_ * fVar20;
                          pfVar32[7] = in_register_0000125c;
                          pfVar39 = pfVar39 + 8;
                          pfVar32 = pfVar32 + 8;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar54 = uVar54 + 1;
                    } while (uVar54 != uVar4);
                  }
                  pauVar31 = pauVar31 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar5);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f8 = a;
      Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar24 = local_f8[1].dims;
      if (iVar24 == 1) {
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
        pfVar32 = (float *)this_00->data;
        if (pfVar32 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)uVar43) {
            pfVar39 = (float *)local_f8->data;
            pauVar31 = (undefined1 (*) [32])local_f8[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar71 = *pauVar31;
                uVar44 = uVar54;
                do {
                  fVar2 = pfVar39[1];
                  fVar16 = pfVar39[2];
                  fVar17 = pfVar39[3];
                  fVar18 = pfVar39[4];
                  fVar19 = pfVar39[5];
                  fVar20 = pfVar39[6];
                  *pfVar32 = auVar71._0_4_ * *pfVar39;
                  pfVar32[1] = auVar71._4_4_ * fVar2;
                  pfVar32[2] = auVar71._8_4_ * fVar16;
                  pfVar32[3] = auVar71._12_4_ * fVar17;
                  pfVar32[4] = auVar71._16_4_ * fVar18;
                  pfVar32[5] = auVar71._20_4_ * fVar19;
                  pfVar32[6] = auVar71._24_4_ * fVar20;
                  pfVar32[7] = in_register_0000125c;
                  pfVar39 = pfVar39 + 8;
                  pfVar32 = pfVar32 + 8;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar31 = pauVar31 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_00417f23;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar5) {
                  pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar39 = (float *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                     (long)local_f8[1].data);
                  pauVar31 = (undefined1 (*) [32])
                             (local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                             (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar54 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar71 = *pauVar31;
                          uVar43 = uVar44;
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            fVar18 = pfVar39[4];
                            fVar19 = pfVar39[5];
                            fVar20 = pfVar39[6];
                            *pfVar32 = auVar71._0_4_ * *pfVar39;
                            pfVar32[1] = auVar71._4_4_ * fVar2;
                            pfVar32[2] = auVar71._8_4_ * fVar16;
                            pfVar32[3] = auVar71._12_4_ * fVar17;
                            pfVar32[4] = auVar71._16_4_ * fVar18;
                            pfVar32[5] = auVar71._20_4_ * fVar19;
                            pfVar32[6] = auVar71._24_4_ * fVar20;
                            pfVar32[7] = in_register_0000125c;
                            pfVar39 = pfVar39 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar31 = pauVar31 + 1;
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_f8[1].dims != 1) {
          if (local_f8[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_108) {
            sVar27 = 0;
            do {
              if (0 < (int)uVar43) {
                pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)local_f8[1].w * sVar27 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pfVar39 = (float *)(local_f8->cstep * sVar27 * local_f8->elemsize +
                                   (long)local_f8->data);
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *pauVar31;
                    uVar44 = uVar54;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      *pfVar32 = auVar71._0_4_ * *pfVar39;
                      pfVar32[1] = auVar71._4_4_ * fVar2;
                      pfVar32[2] = auVar71._8_4_ * fVar16;
                      pfVar32[3] = auVar71._12_4_ * fVar17;
                      pfVar32[4] = auVar71._16_4_ * fVar18;
                      pfVar32[5] = auVar71._20_4_ * fVar19;
                      pfVar32[6] = auVar71._24_4_ * fVar20;
                      pfVar32[7] = in_register_0000125c;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar31 = pauVar31 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)local_108) {
            sVar27 = 0;
            do {
              if (0 < (int)local_100) {
                sVar7 = this_00->cstep;
                sVar10 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)pMVar25->data + sVar27 * 0x20);
                pvVar53 = this_00->data;
                sVar11 = local_f8->cstep;
                sVar9 = local_f8->elemsize;
                pvVar35 = local_f8->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27);
                  *pfVar39 = auVar71._0_4_ * *pfVar32;
                  pfVar39[1] = auVar71._4_4_ * fVar2;
                  pfVar39[2] = auVar71._8_4_ * fVar16;
                  pfVar39[3] = auVar71._12_4_ * fVar17;
                  pfVar39[4] = auVar71._16_4_ * fVar18;
                  pfVar39[5] = auVar71._20_4_ * fVar19;
                  pfVar39[6] = auVar71._24_4_ * fVar20;
                  pfVar39[7] = in_register_0000125c;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_00417f23;
      }
      if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                pvVar53 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar35 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28);
                  *pfVar39 = auVar71._0_4_ * *pfVar32;
                  pfVar39[1] = auVar71._4_4_ * fVar2;
                  pfVar39[2] = auVar71._8_4_ * fVar16;
                  pfVar39[3] = auVar71._12_4_ * fVar17;
                  pfVar39[4] = auVar71._16_4_ * fVar18;
                  pfVar39[5] = auVar71._20_4_ * fVar19;
                  pfVar39[6] = auVar71._24_4_ * fVar20;
                  pfVar39[7] = in_register_0000125c;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                sVar10 = a->cstep;
                pvVar53 = this_00->data;
                pvVar35 = a[1].data;
                sVar11 = a->elemsize;
                pvVar55 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  fVar2 = *(float *)((long)pvVar35 + lVar29);
                  pfVar32 = (float *)((long)pvVar55 + lVar29 * 8 + sVar10 * sVar11 * uVar28);
                  auVar12._4_4_ = fVar2 * pfVar32[1];
                  auVar12._0_4_ = fVar2 * *pfVar32;
                  auVar12._8_4_ = fVar2 * pfVar32[2];
                  auVar12._12_4_ = fVar2 * pfVar32[3];
                  auVar12._16_4_ = fVar2 * pfVar32[4];
                  auVar12._20_4_ = fVar2 * pfVar32[5];
                  auVar12._24_4_ = fVar2 * pfVar32[6];
                  auVar12._28_4_ = fVar2;
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 * 8 + sVar27 * sVar7 * uVar28) =
                       auVar12;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = (__m256 *)sVar7;
      if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a->data + a->cstep * (long)pMVar25 * a->elemsize);
                pvVar53 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  pfVar32 = (float *)((long)pvVar35 + lVar29 + sVar10 * sVar11 * (long)pMVar25);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                  *pfVar39 = auVar71._0_4_ * *pfVar32;
                  pfVar39[1] = auVar71._4_4_ * fVar2;
                  pfVar39[2] = auVar71._8_4_ * fVar16;
                  pfVar39[3] = auVar71._12_4_ * fVar17;
                  pfVar39[4] = auVar71._16_4_ * fVar18;
                  pfVar39[5] = auVar71._20_4_ * fVar19;
                  pfVar39[6] = auVar71._24_4_ * fVar20;
                  pfVar39[7] = in_register_0000125c;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar44 == uVar54) && (iVar23 == 1)) && ((uVar4 == uVar43 && (uVar42 == 1)))) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar53 = a->data;
                pvVar35 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  fVar2 = *(float *)((long)pvVar53 + lVar29);
                  pfVar32 = (float *)((long)pvVar55 + lVar29 * 8 + sVar10 * sVar11 * (long)pMVar25);
                  auVar13._4_4_ = fVar2 * pfVar32[1];
                  auVar13._0_4_ = fVar2 * *pfVar32;
                  auVar13._8_4_ = fVar2 * pfVar32[2];
                  auVar13._12_4_ = fVar2 * pfVar32[3];
                  auVar13._16_4_ = fVar2 * pfVar32[4];
                  auVar13._20_4_ = fVar2 * pfVar32[5];
                  auVar13._24_4_ = fVar2 * pfVar32[6];
                  auVar13._28_4_ = fVar2;
                  *(undefined1 (*) [32])
                   ((long)pvVar35 + lVar29 * 8 + sVar27 * sVar7 * (long)pMVar25) = auVar13;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = a[1].cstep;
                sVar7 = a[1].elemsize;
                pvVar53 = a[1].data;
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(a->cstep * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar42 = uVar54;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      *pfVar32 = auVar71._0_4_ * *pfVar39;
                      pfVar32[1] = auVar71._4_4_ * fVar2;
                      pfVar32[2] = auVar71._8_4_ * fVar16;
                      pfVar32[3] = auVar71._12_4_ * fVar17;
                      pfVar32[4] = auVar71._16_4_ * fVar18;
                      pfVar32[5] = auVar71._20_4_ * fVar19;
                      pfVar32[6] = auVar71._24_4_ * fVar20;
                      pfVar32[7] = in_register_0000125c;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = pMVar37;
      if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = local_f8[1].elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                                  (long)local_f8->data);
                sVar7 = local_f8[1].cstep;
                pvVar53 = local_f8[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar29 = 0;
                    do {
                      pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                      pfVar39 = (float *)((long)pvVar55 + lVar29);
                      auVar14._4_4_ = pfVar32[1] * pfVar39[1];
                      auVar14._0_4_ = *pfVar32 * *pfVar39;
                      auVar14._8_4_ = pfVar32[2] * pfVar39[2];
                      auVar14._12_4_ = pfVar32[3] * pfVar39[3];
                      auVar14._16_4_ = pfVar32[4] * pfVar39[4];
                      auVar14._20_4_ = pfVar32[5] * pfVar39[5];
                      auVar14._24_4_ = pfVar32[6] * pfVar39[6];
                      auVar14._28_4_ = pfVar32[7];
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar14;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar54 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->cstep;
                sVar7 = local_f8->elemsize;
                pvVar53 = local_f8->data;
                pfVar32 = (float *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                   (long)this_00->data);
                pfVar39 = (float *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                   (long)local_f8[1].data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar54 = uVar44;
                    do {
                      fVar2 = pfVar39[1];
                      fVar16 = pfVar39[2];
                      fVar17 = pfVar39[3];
                      fVar18 = pfVar39[4];
                      fVar19 = pfVar39[5];
                      fVar20 = pfVar39[6];
                      *pfVar32 = auVar71._0_4_ * *pfVar39;
                      pfVar32[1] = auVar71._4_4_ * fVar2;
                      pfVar32[2] = auVar71._8_4_ * fVar16;
                      pfVar32[3] = auVar71._12_4_ * fVar17;
                      pfVar32[4] = auVar71._16_4_ * fVar18;
                      pfVar32[5] = auVar71._20_4_ * fVar19;
                      pfVar32[6] = auVar71._24_4_ * fVar20;
                      pfVar32[7] = in_register_0000125c;
                      pfVar39 = pfVar39 + 8;
                      pfVar32 = pfVar32 + 8;
                      uVar54 = uVar54 - 1;
                    } while (uVar54 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                  (long)local_f8[1].data);
                sVar7 = local_f8->cstep;
                pvVar53 = local_f8->data;
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar29 = 0;
                    do {
                      pfVar32 = (float *)((long)pvVar55 + lVar29);
                      pfVar39 = (float *)((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25);
                      auVar15._4_4_ = pfVar32[1] * pfVar39[1];
                      auVar15._0_4_ = *pfVar32 * *pfVar39;
                      auVar15._8_4_ = pfVar32[2] * pfVar39[2];
                      auVar15._12_4_ = pfVar32[3] * pfVar39[3];
                      auVar15._16_4_ = pfVar32[4] * pfVar39[4];
                      auVar15._20_4_ = pfVar32[5] * pfVar39[5];
                      auVar15._24_4_ = pfVar32[6] * pfVar39[6];
                      auVar15._28_4_ = pfVar32[7];
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar15;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar44 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_0041acc9:
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      local_f8 = a;
      goto LAB_0040e8d5;
    case 4:
      if (a[1].dims != 4) {
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar23 = a[1].dims;
        iVar24 = (int)local_108;
        if (iVar23 != 1) {
          if (iVar23 == 3) {
            if (0 < iVar24) {
              sVar27 = 0;
              do {
                if (0 < iVar3) {
                  pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar31 = (undefined1 (*) [32])
                             (a[1].cstep * sVar27 * a[1].elemsize + (long)a[1].data);
                  pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar54) {
                          auVar71 = *pauVar31;
                          uVar44 = uVar54;
                          do {
                            fVar2 = pfVar39[1];
                            fVar16 = pfVar39[2];
                            fVar17 = pfVar39[3];
                            fVar18 = pfVar39[4];
                            fVar19 = pfVar39[5];
                            fVar20 = pfVar39[6];
                            *pfVar32 = auVar71._0_4_ * *pfVar39;
                            pfVar32[1] = auVar71._4_4_ * fVar2;
                            pfVar32[2] = auVar71._8_4_ * fVar16;
                            pfVar32[3] = auVar71._12_4_ * fVar17;
                            pfVar32[4] = auVar71._16_4_ * fVar18;
                            pfVar32[5] = auVar71._20_4_ * fVar19;
                            pfVar32[6] = auVar71._24_4_ * fVar20;
                            pfVar32[7] = in_register_0000125c;
                            pfVar39 = pfVar39 + 8;
                            pfVar32 = pfVar32 + 8;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar31 = pauVar31 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_108);
              return 0;
            }
            return 0;
          }
          if (iVar23 != 2) {
            return 0;
          }
          if (0 < iVar24) {
            sVar27 = 0;
            do {
              if (0 < iVar3) {
                pfVar32 = (float *)(this_00->cstep * sVar27 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar31 = (undefined1 (*) [32])
                           ((long)a[1].w * sVar27 * a[1].elemsize + (long)a[1].data);
                pfVar39 = (float *)(a->cstep * sVar27 * a->elemsize + (long)a->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar71 = *pauVar31;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          fVar2 = pfVar39[1];
                          fVar16 = pfVar39[2];
                          fVar17 = pfVar39[3];
                          fVar18 = pfVar39[4];
                          fVar19 = pfVar39[5];
                          fVar20 = pfVar39[6];
                          *pfVar32 = auVar71._0_4_ * *pfVar39;
                          pfVar32[1] = auVar71._4_4_ * fVar2;
                          pfVar32[2] = auVar71._8_4_ * fVar16;
                          pfVar32[3] = auVar71._12_4_ * fVar17;
                          pfVar32[4] = auVar71._16_4_ * fVar18;
                          pfVar32[5] = auVar71._20_4_ * fVar19;
                          pfVar32[6] = auVar71._24_4_ * fVar20;
                          pfVar32[7] = in_register_0000125c;
                          pfVar39 = pfVar39 + 8;
                          pfVar32 = pfVar32 + 8;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar31 = pauVar31 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar3);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        pMVar25 = local_e8;
        if ((uint)local_110 != 1 || a[1].w != 1) {
          if (0 < iVar24) {
            sVar27 = 0;
            do {
              if (0 < (int)local_100) {
                sVar7 = a->cstep;
                sVar10 = a->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)local_e8->data + sVar27 * 0x20);
                pvVar53 = a->data;
                sVar11 = this_00->cstep;
                sVar9 = this_00->elemsize;
                pvVar35 = this_00->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  pfVar32 = (float *)((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27);
                  fVar2 = pfVar32[1];
                  fVar16 = pfVar32[2];
                  fVar17 = pfVar32[3];
                  fVar18 = pfVar32[4];
                  fVar19 = pfVar32[5];
                  fVar20 = pfVar32[6];
                  pfVar39 = (float *)((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27);
                  *pfVar39 = auVar71._0_4_ * *pfVar32;
                  pfVar39[1] = auVar71._4_4_ * fVar2;
                  pfVar39[2] = auVar71._8_4_ * fVar16;
                  pfVar39[3] = auVar71._12_4_ * fVar17;
                  pfVar39[4] = auVar71._16_4_ * fVar18;
                  pfVar39[5] = auVar71._20_4_ * fVar19;
                  pfVar39[6] = auVar71._24_4_ * fVar20;
                  pfVar39[7] = in_register_0000125c;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_00417f23;
      }
      goto LAB_0040e8d5;
    }
LAB_00412528:
    a = local_f8;
    if (iVar24 != 2) {
      return 0;
    }
LAB_0040e8d5:
    iVar23 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
                       (a,pMVar25,this_00,local_118);
    return iVar23;
  case 3:
    pMVar37 = pMVar25;
    goto LAB_0040d478;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
    uVar54 = a->w;
    uVar43 = a->h;
    iVar3 = a->d;
    uVar42 = a->c;
    local_108 = (ulong)uVar42;
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
    sVar27 = a->elemsize;
    uVar44 = a[1].w;
    uVar4 = a[1].h;
    iVar5 = a[1].d;
    uVar6 = a[1].c;
    pMVar37 = (Mat *)(ulong)uVar6;
    iVar40 = uVar4 * uVar44 * iVar5;
    sVar7 = a[1].elemsize;
    local_f0 = sVar27;
    switch(a->dims) {
    case 1:
      if (iVar23 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_0040f35e_caseD_1;
        case 2:
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pauVar31 = (undefined1 (*) [32])this_00->data;
          if (pauVar31 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar38 = (undefined1 (*) [32])a->data;
              pauVar45 = (undefined1 (*) [32])a[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar71 = *pauVar38;
                  uVar43 = uVar44;
                  do {
                    auVar74 = vmaxps_avx(auVar71,*pauVar45);
                    *pauVar31 = auVar74;
                    pauVar45 = pauVar45 + 1;
                    pauVar31 = pauVar31 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar38 = pauVar38 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar74 = vmaxps_avx(auVar71,*(undefined1 (*) [32])
                                                  ((long)pvVar35 +
                                                  lVar29 + sVar10 * sVar11 * (long)pMVar25));
                    *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25)
                         = auVar74;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar74 = vmaxps_avx(auVar71,*(undefined1 (*) [32])
                                                  ((long)pvVar35 +
                                                  lVar29 + sVar10 * sVar11 * (long)pMVar25));
                    *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25)
                         = auVar74;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_0040d526;
    case 2:
      pAVar8 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (a[1].cstep * (long)pMVar25 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)a->w * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *pauVar45;
                    uVar43 = uVar44;
                    do {
                      auVar74 = vmaxps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar5) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)local_f8->w * (long)pMVar25 * local_f8->elemsize +
                           (long)local_f8->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar4) {
                    auVar71 = *pauVar45;
                    uVar54 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          auVar74 = vmaxps_avx(auVar71,*pauVar38);
                          *pauVar31 = auVar74;
                          pauVar38 = pauVar38 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar54 = uVar54 + 1;
                    } while (uVar54 != uVar4);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar5);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f8 = a;
      Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar24 = local_f8[1].dims;
      if (iVar24 == 1) {
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
        pauVar31 = (undefined1 (*) [32])this_00->data;
        if (pauVar31 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)uVar43) {
            pauVar38 = (undefined1 (*) [32])local_f8->data;
            pauVar45 = (undefined1 (*) [32])local_f8[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar71 = *pauVar45;
                uVar44 = uVar54;
                do {
                  auVar74 = vmaxps_avx(auVar71,*pauVar38);
                  *pauVar31 = auVar74;
                  pauVar38 = pauVar38 + 1;
                  pauVar31 = pauVar31 + 1;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_00417d91;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar5) {
                  pauVar31 = (undefined1 (*) [32])
                             (this_00->cstep * (long)pMVar25 * this_00->elemsize +
                             (long)this_00->data);
                  pauVar38 = (undefined1 (*) [32])
                             (local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar45 = (undefined1 (*) [32])
                             (local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                             (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar54 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar71 = *pauVar45;
                          uVar43 = uVar44;
                          do {
                            auVar74 = vmaxps_avx(auVar71,*pauVar38);
                            *pauVar31 = auVar74;
                            pauVar38 = pauVar38 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_f8[1].dims != 1) {
          if (local_f8[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_108) {
            sVar27 = 0;
            do {
              if (0 < (int)uVar43) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * sVar27 * this_00->elemsize + (long)this_00->data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)local_f8[1].w * sVar27 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pauVar38 = (undefined1 (*) [32])
                           (local_f8->cstep * sVar27 * local_f8->elemsize + (long)local_f8->data);
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *pauVar45;
                    uVar44 = uVar54;
                    do {
                      auVar74 = vmaxps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)local_108) {
            sVar27 = 0;
            do {
              if (0 < (int)local_100) {
                sVar7 = this_00->cstep;
                sVar10 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)pMVar25->data + sVar27 * 0x20);
                pvVar53 = this_00->data;
                sVar11 = local_f8->cstep;
                sVar9 = local_f8->elemsize;
                pvVar35 = local_f8->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  auVar74 = vmaxps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27));
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27) = auVar74
                  ;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_00417d91;
      }
      if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                pvVar53 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar35 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  auVar74 = vmaxps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28))
                  ;
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) = auVar74
                  ;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                sVar10 = a->cstep;
                pvVar53 = this_00->data;
                pvVar35 = a[1].data;
                sVar11 = a->elemsize;
                pvVar55 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  uVar1 = *(undefined4 *)((long)pvVar35 + lVar29);
                  auVar69._4_4_ = uVar1;
                  auVar69._0_4_ = uVar1;
                  auVar69._8_4_ = uVar1;
                  auVar69._12_4_ = uVar1;
                  auVar69._16_4_ = uVar1;
                  auVar69._20_4_ = uVar1;
                  auVar69._24_4_ = uVar1;
                  auVar69._28_4_ = uVar1;
                  auVar71 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                                ((long)pvVar55 +
                                                lVar29 * 8 + sVar10 * sVar11 * uVar28));
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 * 8 + sVar27 * sVar7 * uVar28) =
                       auVar71;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = (__m256 *)sVar7;
      if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a->data + a->cstep * (long)pMVar25 * a->elemsize);
                pvVar53 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  auVar74 = vmaxps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar35 +
                                                lVar29 + sVar10 * sVar11 * (long)pMVar25));
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25) =
                       auVar74;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 == uVar54) && (iVar23 == 1)) && (uVar4 == uVar43)) && (uVar42 == 1)) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar53 = a->data;
                pvVar35 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  uVar1 = *(undefined4 *)((long)pvVar53 + lVar29);
                  auVar72._4_4_ = uVar1;
                  auVar72._0_4_ = uVar1;
                  auVar72._8_4_ = uVar1;
                  auVar72._12_4_ = uVar1;
                  auVar72._16_4_ = uVar1;
                  auVar72._20_4_ = uVar1;
                  auVar72._24_4_ = uVar1;
                  auVar72._28_4_ = uVar1;
                  auVar71 = vmaxps_avx(auVar72,*(undefined1 (*) [32])
                                                ((long)pvVar55 +
                                                lVar29 * 8 + sVar10 * sVar11 * (long)pMVar25));
                  *(undefined1 (*) [32])
                   ((long)pvVar35 + lVar29 * 8 + sVar27 * sVar7 * (long)pMVar25) = auVar71;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = a[1].cstep;
                sVar7 = a[1].elemsize;
                pvVar53 = a[1].data;
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (a->cstep * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar42 = uVar54;
                    do {
                      auVar74 = vmaxps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = pMVar37;
      if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = local_f8[1].elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                                  (long)local_f8->data);
                sVar7 = local_f8[1].cstep;
                pvVar53 = local_f8[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar29 = 0;
                    do {
                      auVar71 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar55 + lVar29),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25
                                            ));
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar71;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar54 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->cstep;
                sVar7 = local_f8->elemsize;
                pvVar53 = local_f8->data;
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar54 = uVar44;
                    do {
                      auVar74 = vmaxps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar54 = uVar54 - 1;
                    } while (uVar54 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                  (long)local_f8[1].data);
                sVar7 = local_f8->cstep;
                pvVar53 = local_f8->data;
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar29 = 0;
                    do {
                      auVar71 = vmaxps_avx(*(undefined1 (*) [32])
                                            ((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25
                                            ),*(undefined1 (*) [32])((long)pvVar55 + lVar29));
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar71;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar44 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_0041acb9:
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      local_f8 = a;
      goto LAB_0040e676;
    case 4:
      if (a[1].dims != 4) {
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar23 = a[1].dims;
        iVar24 = (int)local_108;
        if (iVar23 != 1) {
          if (iVar23 == 3) {
            if (0 < iVar24) {
              sVar27 = 0;
              do {
                if (0 < iVar3) {
                  pauVar31 = (undefined1 (*) [32])
                             (this_00->cstep * sVar27 * this_00->elemsize + (long)this_00->data);
                  pauVar45 = (undefined1 (*) [32])
                             (a[1].cstep * sVar27 * a[1].elemsize + (long)a[1].data);
                  pauVar38 = (undefined1 (*) [32])(a->cstep * sVar27 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar54) {
                          auVar71 = *pauVar45;
                          uVar44 = uVar54;
                          do {
                            auVar74 = vmaxps_avx(auVar71,*pauVar38);
                            *pauVar31 = auVar74;
                            pauVar38 = pauVar38 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_108);
              return 0;
            }
            return 0;
          }
          if (iVar23 != 2) {
            return 0;
          }
          if (0 < iVar24) {
            sVar27 = 0;
            do {
              if (0 < iVar3) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * sVar27 * this_00->elemsize + (long)this_00->data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)a[1].w * sVar27 * a[1].elemsize + (long)a[1].data);
                pauVar38 = (undefined1 (*) [32])(a->cstep * sVar27 * a->elemsize + (long)a->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar71 = *pauVar45;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          auVar74 = vmaxps_avx(auVar71,*pauVar38);
                          *pauVar31 = auVar74;
                          pauVar38 = pauVar38 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar3);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        pMVar25 = local_e8;
        if ((uint)local_110 != 1 || a[1].w != 1) {
          if (0 < iVar24) {
            sVar27 = 0;
            do {
              if (0 < (int)local_100) {
                sVar7 = a->cstep;
                sVar10 = a->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)local_e8->data + sVar27 * 0x20);
                pvVar53 = a->data;
                sVar11 = this_00->cstep;
                sVar9 = this_00->elemsize;
                pvVar35 = this_00->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  auVar74 = vmaxps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar53 + lVar29 + sVar7 * sVar10 * sVar27));
                  *(undefined1 (*) [32])((long)pvVar35 + lVar29 + sVar11 * sVar9 * sVar27) = auVar74
                  ;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_00417d91;
      }
      goto LAB_0040e676;
    }
LAB_00412074:
    a = local_f8;
    if (iVar24 != 2) {
      return 0;
    }
LAB_0040e676:
    iVar23 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
                       (a,pMVar25,this_00,local_118);
    return iVar23;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
    uVar54 = a->w;
    uVar43 = a->h;
    iVar3 = a->d;
    uVar42 = a->c;
    local_108 = (ulong)uVar42;
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar43 * uVar54 * iVar3);
    sVar27 = a->elemsize;
    uVar44 = a[1].w;
    uVar4 = a[1].h;
    iVar5 = a[1].d;
    uVar6 = a[1].c;
    pMVar37 = (Mat *)(ulong)uVar6;
    iVar40 = uVar4 * uVar44 * iVar5;
    sVar7 = a[1].elemsize;
    local_f0 = sVar27;
    switch(a->dims) {
    case 1:
      if (iVar23 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_0040d334_caseD_1;
        case 2:
          Mat::create(this_00,uVar44,uVar4,sVar7,iVar24,opt->blob_allocator);
          pauVar31 = (undefined1 (*) [32])this_00->data;
          if (pauVar31 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar4) {
              pauVar38 = (undefined1 (*) [32])a->data;
              pauVar45 = (undefined1 (*) [32])a[1].data;
              uVar54 = 0;
              do {
                if (0 < (int)uVar44) {
                  auVar71 = *pauVar38;
                  uVar43 = uVar44;
                  do {
                    auVar74 = vminps_avx(auVar71,*pauVar45);
                    *pauVar31 = auVar74;
                    pauVar45 = pauVar45 + 1;
                    pauVar31 = pauVar31 + 1;
                    uVar43 = uVar43 - 1;
                  } while (uVar43 != 0);
                }
                pauVar38 = pauVar38 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar4);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar74 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                  ((long)pvVar35 +
                                                  lVar29 + sVar10 * sVar11 * (long)pMVar25));
                    *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25)
                         = auVar74;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar40) {
                  sVar27 = this_00->cstep;
                  sVar7 = this_00->elemsize;
                  auVar71 = *(undefined1 (*) [32])((long)a->data + (long)pMVar25 * 0x20);
                  pvVar53 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar35 = a[1].data;
                  lVar29 = 0;
                  iVar23 = iVar40;
                  do {
                    auVar74 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                  ((long)pvVar35 +
                                                  lVar29 + sVar10 * sVar11 * (long)pMVar25));
                    *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25)
                         = auVar74;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_0040d69c;
    case 2:
      pAVar8 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (a[1].cstep * (long)pMVar25 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)a->w * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *pauVar45;
                    uVar43 = uVar44;
                    do {
                      auVar74 = vminps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar43 = uVar43 - 1;
                    } while (uVar43 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar5) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)local_f8->w * (long)pMVar25 * local_f8->elemsize +
                           (long)local_f8->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar4) {
                    auVar71 = *pauVar45;
                    uVar54 = 0;
                    do {
                      uVar43 = uVar44;
                      if (0 < (int)uVar44) {
                        do {
                          auVar74 = vminps_avx(auVar71,*pauVar38);
                          *pauVar31 = auVar74;
                          pauVar38 = pauVar38 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar43 = uVar43 - 1;
                        } while (uVar43 != 0);
                      }
                      uVar54 = uVar54 + 1;
                    } while (uVar54 != uVar4);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar5);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f8 = a;
      Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,pAVar8);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar24 = local_f8[1].dims;
      if (iVar24 == 1) {
        Mat::create(this_00,uVar54,uVar43,sVar27,iVar23,local_118->blob_allocator);
        pauVar31 = (undefined1 (*) [32])this_00->data;
        if (pauVar31 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)uVar43) {
            pauVar38 = (undefined1 (*) [32])local_f8->data;
            pauVar45 = (undefined1 (*) [32])local_f8[1].data;
            uVar42 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar71 = *pauVar45;
                uVar44 = uVar54;
                do {
                  auVar74 = vminps_avx(auVar71,*pauVar38);
                  *pauVar31 = auVar74;
                  pauVar38 = pauVar38 + 1;
                  pauVar31 = pauVar31 + 1;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar43);
            return 0;
          }
          return 0;
        }
        goto LAB_004180c2;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_f8 = a;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar7,iVar24,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar6) {
              pMVar25 = (Mat *)0x0;
              do {
                if (0 < iVar5) {
                  pauVar31 = (undefined1 (*) [32])
                             (this_00->cstep * (long)pMVar25 * this_00->elemsize +
                             (long)this_00->data);
                  pauVar38 = (undefined1 (*) [32])
                             (local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  pauVar45 = (undefined1 (*) [32])
                             (local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                             (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar54 = 0;
                      do {
                        if (0 < (int)uVar44) {
                          auVar71 = *pauVar45;
                          uVar43 = uVar44;
                          do {
                            auVar74 = vminps_avx(auVar71,*pauVar38);
                            *pauVar31 = auVar74;
                            pauVar38 = pauVar38 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar43 = uVar43 - 1;
                          } while (uVar43 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar54 = uVar54 + 1;
                      } while (uVar54 != uVar4);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar5);
                }
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar25 != pMVar37);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_f8[1].dims != 1) {
          if (local_f8[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)uVar43) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)local_f8[1].w * uVar28 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pauVar38 = (undefined1 (*) [32])
                           (local_f8->cstep * uVar28 * local_f8->elemsize + (long)local_f8->data);
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *pauVar45;
                    uVar44 = uVar54;
                    do {
                      auVar74 = vminps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                  }
                  pauVar45 = pauVar45 + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        a = local_f8;
        if ((uint)local_110 != 1 || local_f8[1].w != 1) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)pMVar25->data + uVar28 * 0x20);
                pvVar53 = this_00->data;
                sVar10 = local_f8->cstep;
                sVar11 = local_f8->elemsize;
                pvVar35 = local_f8->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  auVar74 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28))
                  ;
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) = auVar74
                  ;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_004180c2;
      }
      if (uVar6 == uVar42 && (uVar4 == 1 && (uVar44 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar28 * a[1].elemsize);
                pvVar53 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar35 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  auVar74 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28))
                  ;
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28) = auVar74
                  ;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_108) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                sVar10 = a->cstep;
                pvVar53 = this_00->data;
                pvVar35 = a[1].data;
                sVar11 = a->elemsize;
                pvVar55 = a->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  uVar1 = *(undefined4 *)((long)pvVar35 + lVar29);
                  auVar71._4_4_ = uVar1;
                  auVar71._0_4_ = uVar1;
                  auVar71._8_4_ = uVar1;
                  auVar71._12_4_ = uVar1;
                  auVar71._16_4_ = uVar1;
                  auVar71._20_4_ = uVar1;
                  auVar71._24_4_ = uVar1;
                  auVar71._28_4_ = uVar1;
                  auVar71 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar55 +
                                                lVar29 * 8 + sVar10 * sVar11 * uVar28));
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 * 8 + sVar27 * sVar7 * uVar28) =
                       auVar71;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = (__m256 *)sVar7;
      if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar71 = *(undefined1 (*) [32])
                           ((long)a->data + a->cstep * (long)pMVar25 * a->elemsize);
                pvVar53 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar35 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  auVar74 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar35 +
                                                lVar29 + sVar10 * sVar11 * (long)pMVar25));
                  *(undefined1 (*) [32])((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25) =
                       auVar74;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar44 == uVar54) && (iVar23 == 1)) && ((uVar4 == uVar43 && (uVar42 == 1)))) {
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < iVar40) {
                sVar27 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar53 = a->data;
                pvVar35 = this_00->data;
                sVar10 = a[1].cstep;
                sVar11 = a[1].elemsize;
                pvVar55 = a[1].data;
                lVar29 = 0;
                iVar23 = iVar40;
                do {
                  uVar1 = *(undefined4 *)((long)pvVar53 + lVar29);
                  auVar74._4_4_ = uVar1;
                  auVar74._0_4_ = uVar1;
                  auVar74._8_4_ = uVar1;
                  auVar74._12_4_ = uVar1;
                  auVar74._16_4_ = uVar1;
                  auVar74._20_4_ = uVar1;
                  auVar74._24_4_ = uVar1;
                  auVar74._28_4_ = uVar1;
                  auVar71 = vminps_avx(auVar74,*(undefined1 (*) [32])
                                                ((long)pvVar55 +
                                                lVar29 * 8 + sVar10 * sVar11 * (long)pMVar25));
                  *(undefined1 (*) [32])
                   ((long)pvVar35 + lVar29 * 8 + sVar27 * sVar7 * (long)pMVar25) = auVar71;
                  lVar29 = lVar29 + 4;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ 1) == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar6) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = a[1].cstep;
                sVar7 = a[1].elemsize;
                pvVar53 = a[1].data;
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (a->cstep * (long)pMVar25 * a->elemsize + (long)a->data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar42 = uVar54;
                    do {
                      auVar74 = vminps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar42 = uVar42 - 1;
                    } while (uVar42 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != pMVar37);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = pMVar37;
      if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar43) {
                sVar27 = local_f8[1].elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8->cstep * (long)pMVar25 * local_f8->elemsize +
                                  (long)local_f8->data);
                sVar7 = local_f8[1].cstep;
                pvVar53 = local_f8[1].data;
                uVar42 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar29 = 0;
                    do {
                      auVar71 = vminps_avx(*(undefined1 (*) [32])((long)pvVar55 + lVar29),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25
                                            ));
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar71;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar54 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar42 = uVar42 + 1;
                } while (uVar42 != uVar43);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->cstep;
                sVar7 = local_f8->elemsize;
                pvVar53 = local_f8->data;
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * (long)pMVar25 * this_00->elemsize + (long)this_00->data
                           );
                pauVar38 = (undefined1 (*) [32])
                           (local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                uVar28 = 0;
                do {
                  if (0 < (int)uVar44) {
                    auVar71 = *(undefined1 (*) [32])
                               ((long)pvVar53 + uVar28 * 0x20 + sVar27 * (long)pMVar25 * sVar7);
                    uVar54 = uVar44;
                    do {
                      auVar74 = vminps_avx(auVar71,*pauVar38);
                      *pauVar31 = auVar74;
                      pauVar38 = pauVar38 + 1;
                      pauVar31 = pauVar31 + 1;
                      uVar54 = uVar54 - 1;
                    } while (uVar54 != 0);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
        local_f8 = a;
        Mat::create(this_00,uVar44,uVar4,uVar6,sVar7,iVar24,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e8) {
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar4) {
                sVar27 = local_f8->elemsize;
                pvVar35 = (void *)(this_00->cstep * (long)pMVar25 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar55 = (void *)(local_f8[1].cstep * (long)pMVar25 * local_f8[1].elemsize +
                                  (long)local_f8[1].data);
                sVar7 = local_f8->cstep;
                pvVar53 = local_f8->data;
                uVar54 = 0;
                do {
                  if (0 < (int)uVar44) {
                    lVar29 = 0;
                    do {
                      auVar71 = vminps_avx(*(undefined1 (*) [32])
                                            ((long)pvVar53 + lVar29 + sVar27 * sVar7 * (long)pMVar25
                                            ),*(undefined1 (*) [32])((long)pvVar55 + lVar29));
                      *(undefined1 (*) [32])((long)pvVar35 + lVar29) = auVar71;
                      lVar29 = lVar29 + 0x20;
                    } while ((ulong)uVar44 << 5 != lVar29);
                    pvVar35 = (void *)((long)pvVar35 + lVar29);
                    pvVar55 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar4);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar25 != local_e8);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_0041acf8:
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      local_f8 = a;
      goto LAB_0040ef1d;
    case 4:
      if (a[1].dims != 4) {
        local_e8 = pMVar25;
        Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,sVar27,iVar23,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar23 = a[1].dims;
        iVar24 = (int)local_108;
        if (iVar23 != 1) {
          if (iVar23 == 3) {
            if (0 < iVar24) {
              uVar28 = 0;
              do {
                if (0 < iVar3) {
                  pauVar31 = (undefined1 (*) [32])
                             (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                  pauVar45 = (undefined1 (*) [32])
                             (a[1].cstep * uVar28 * a[1].elemsize + (long)a[1].data);
                  pauVar38 = (undefined1 (*) [32])(a->cstep * uVar28 * a->elemsize + (long)a->data);
                  iVar23 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar42 = 0;
                      do {
                        if (0 < (int)uVar54) {
                          auVar71 = *pauVar45;
                          uVar44 = uVar54;
                          do {
                            auVar74 = vminps_avx(auVar71,*pauVar38);
                            *pauVar31 = auVar74;
                            pauVar38 = pauVar38 + 1;
                            pauVar31 = pauVar31 + 1;
                            uVar44 = uVar44 - 1;
                          } while (uVar44 != 0);
                        }
                        pauVar45 = pauVar45 + 1;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar43);
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar3);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_108);
              return 0;
            }
            return 0;
          }
          if (iVar23 != 2) {
            return 0;
          }
          if (0 < iVar24) {
            uVar28 = 0;
            do {
              if (0 < iVar3) {
                pauVar31 = (undefined1 (*) [32])
                           (this_00->cstep * uVar28 * this_00->elemsize + (long)this_00->data);
                pauVar45 = (undefined1 (*) [32])
                           ((long)a[1].w * uVar28 * a[1].elemsize + (long)a[1].data);
                pauVar38 = (undefined1 (*) [32])(a->cstep * uVar28 * a->elemsize + (long)a->data);
                iVar23 = 0;
                do {
                  if (0 < (int)uVar43) {
                    auVar71 = *pauVar45;
                    uVar42 = 0;
                    do {
                      uVar44 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          auVar74 = vminps_avx(auVar71,*pauVar38);
                          *pauVar31 = auVar74;
                          pauVar38 = pauVar38 + 1;
                          pauVar31 = pauVar31 + 1;
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != uVar43);
                  }
                  pauVar45 = pauVar45 + 1;
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar3);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        pMVar25 = local_e8;
        if ((uint)local_110 != 1 || a[1].w != 1) {
          if (0 < iVar24) {
            uVar28 = 0;
            do {
              if (0 < (int)local_100) {
                sVar27 = a->cstep;
                sVar7 = a->elemsize;
                auVar71 = *(undefined1 (*) [32])((long)local_e8->data + uVar28 * 0x20);
                pvVar53 = a->data;
                sVar10 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar35 = this_00->data;
                lVar29 = 0;
                iVar23 = (int)local_100;
                do {
                  auVar74 = vminps_avx(auVar71,*(undefined1 (*) [32])
                                                ((long)pvVar53 + lVar29 + sVar27 * sVar7 * uVar28));
                  *(undefined1 (*) [32])((long)pvVar35 + lVar29 + sVar10 * sVar11 * uVar28) =
                       auVar74;
                  lVar29 = lVar29 + 0x20;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_108);
            return 0;
          }
          return 0;
        }
        goto LAB_004180c2;
      }
LAB_0040ef14:
      local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar24);
      goto LAB_0040ef1d;
    }
LAB_0041287e:
    a = local_f8;
    if (iVar24 != 2) {
      return 0;
    }
LAB_0040ef1d:
    iVar23 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
                       (a,pMVar25,this_00,local_118);
    return iVar23;
  case 6:
    if (a->dims - 1U < 4) {
      uVar54 = a->w;
      local_100 = (__m256 *)(ulong)uVar54;
      uVar43 = a->h;
      local_110 = (__m256 *)(ulong)uVar43;
      iVar3 = a->d;
      uVar42 = a->c;
      uVar26 = (ulong)uVar42;
      local_d8 = CONCAT44(local_d8._4_4_,uVar43 * uVar54 * iVar3);
      local_c8 = a->elemsize;
      uVar44 = a[1].w;
      uVar28 = (ulong)uVar44;
      uVar4 = a[1].h;
      local_118 = (Option *)(ulong)uVar4;
      iVar5 = a[1].d;
      uVar6 = a[1].c;
      local_f0 = (ulong)uVar6;
      local_108 = CONCAT44(local_108._4_4_,iVar5);
      local_60 = CONCAT44(local_60._4_4_,uVar4 * uVar44 * iVar5);
      sVar27 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar23 == 1 && uVar54 == 1) {
          local_e8 = pMVar25;
          local_e0 = this_00;
          iVar23 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                             (a,pMVar25,this_00,opt);
          return iVar23;
        }
        switch(a[1].dims) {
        case 1:
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar54,local_c8,iVar23,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar24 == 1 && local_f8[1].w == 1) goto LAB_00416add;
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                    (local_f8,pMVar25,this_00,opt);
          break;
        case 2:
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,sVar27,iVar24,opt->blob_allocator);
          puVar36 = (undefined8 *)this_00->data;
          if (puVar36 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_118) {
              local_110 = (__m256 *)local_f8->data;
              pafVar46 = (__m256 *)local_f8[1].data;
              local_100 = (__m256 *)((ulong)local_100 & 0xffffffff00000000);
              do {
                local_a0 = *local_110;
                uVar26 = uVar28;
                if (0 < (int)uVar44) {
                  do {
                    uVar90 = *(undefined8 *)*pafVar46;
                    uVar89 = *(undefined8 *)(*pafVar46 + 2);
                    uVar92 = *(undefined8 *)(*pafVar46 + 4);
                    uVar93 = *(undefined8 *)(*pafVar46 + 6);
                    local_c0 = *pafVar46;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              (&local_119,&local_a0,&local_c0);
                    *puVar36 = uVar90;
                    puVar36[1] = uVar89;
                    puVar36[2] = uVar92;
                    puVar36[3] = uVar93;
                    pafVar46 = pafVar46 + 1;
                    puVar36 = puVar36 + 4;
                    uVar54 = (int)uVar26 - 1;
                    uVar26 = (ulong)uVar54;
                  } while (uVar54 != 0);
                }
                local_110 = local_110 + 1;
                iVar23 = (int)local_100 + 1;
                local_100 = (__m256 *)CONCAT44(local_100._4_4_,iVar23);
              } while (iVar23 != (int)local_118);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar27,iVar24,opt->blob_allocator);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep != 0) {
            if (0 < (int)local_f0) {
              local_110 = (__m256 *)0x0;
              do {
                local_a0 = *(__m256 *)((long)local_f8->data + (long)local_110 * 0x20);
                if (0 < (int)local_60) {
                  lVar52 = local_e0->cstep * local_e0->elemsize * (long)local_110;
                  pvVar53 = local_e0->data;
                  local_118 = (Option *)
                              (local_f8[1].cstep * local_f8[1].elemsize * (long)local_110 +
                              (long)local_f8[1].data);
                  lVar29 = 0;
                  iVar23 = (int)local_60;
                  do {
                    pafVar46 = (__m256 *)((long)local_118 + lVar29);
                    uVar90 = *(undefined8 *)*pafVar46;
                    uVar89 = *(undefined8 *)(*pafVar46 + 2);
                    uVar92 = *(undefined8 *)(*pafVar46 + 4);
                    uVar93 = *(undefined8 *)(*pafVar46 + 6);
                    local_c0 = *pafVar46;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              (&local_119,&local_a0,&local_c0);
                    puVar36 = (undefined8 *)((long)pvVar53 + lVar29 + lVar52);
                    *puVar36 = uVar90;
                    puVar36[1] = uVar89;
                    puVar36[2] = uVar92;
                    puVar36[3] = uVar93;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                local_110 = (__m256 *)((long)local_110 + 1);
              } while (local_110 != (__m256 *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar27,iVar24,opt->blob_allocator);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep != 0) {
            if (0 < (int)local_f0) {
              local_110 = (__m256 *)0x0;
              do {
                local_a0 = *(__m256 *)((long)local_f8->data + (long)local_110 * 0x20);
                if (0 < (int)local_60) {
                  lVar52 = local_e0->cstep * local_e0->elemsize * (long)local_110;
                  pvVar53 = local_e0->data;
                  local_118 = (Option *)
                              (local_f8[1].cstep * local_f8[1].elemsize * (long)local_110 +
                              (long)local_f8[1].data);
                  lVar29 = 0;
                  iVar23 = (int)local_60;
                  do {
                    pafVar46 = (__m256 *)((long)local_118 + lVar29);
                    uVar90 = *(undefined8 *)*pafVar46;
                    uVar89 = *(undefined8 *)(*pafVar46 + 2);
                    uVar92 = *(undefined8 *)(*pafVar46 + 4);
                    uVar93 = *(undefined8 *)(*pafVar46 + 6);
                    local_c0 = *pafVar46;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              (&local_119,&local_a0,&local_c0);
                    puVar36 = (undefined8 *)((long)pvVar53 + lVar29 + lVar52);
                    *puVar36 = uVar90;
                    puVar36[1] = uVar89;
                    puVar36[2] = uVar92;
                    puVar36[3] = uVar93;
                    lVar29 = lVar29 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                local_110 = (__m256 *)((long)local_110 + 1);
              } while (local_110 != (__m256 *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        pAVar8 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,uVar6,sVar27,iVar24,pAVar8);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep != 0) {
            if (0 < (int)local_f0) {
              local_108 = 0;
              pOVar30 = local_118;
              do {
                if (0 < (int)pOVar30) {
                  pafVar46 = (__m256 *)
                             (local_e0->cstep * local_108 * local_e0->elemsize +
                             (long)local_e0->data);
                  pafVar33 = (__m256 *)
                             (local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  local_110 = (__m256 *)
                              ((long)local_f8->w * local_108 * local_f8->elemsize +
                              (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    local_100 = (__m256 *)CONCAT44(local_100._4_4_,iVar23);
                    local_a0 = *local_110;
                    uVar26 = uVar28;
                    if (0 < (int)uVar44) {
                      do {
                        local_c0 = *pafVar33;
                        BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                  (&local_119,&local_a0,&local_c0);
                        *pafVar46 = local_c0;
                        pafVar33 = pafVar33 + 1;
                        pafVar46 = pafVar46 + 1;
                        uVar54 = (int)uVar26 - 1;
                        uVar26 = (ulong)uVar54;
                      } while (uVar54 != 0);
                    }
                    local_110 = local_110 + 1;
                    iVar23 = (int)local_100 + 1;
                    pOVar30 = local_118;
                  } while (iVar23 != (int)local_118);
                }
                local_108 = local_108 + 1;
              } while (local_108 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar27,iVar24,pAVar8);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep != 0) {
            if (0 < (int)local_f0) {
              local_d8 = 0;
              pOVar30 = local_118;
              do {
                if (0 < (int)local_108) {
                  pafVar33 = (__m256 *)
                             (local_e0->cstep * local_d8 * local_e0->elemsize + (long)local_e0->data
                             );
                  pafVar46 = (__m256 *)
                             (local_f8[1].cstep * local_d8 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  local_100 = (__m256 *)
                              ((long)local_f8->w * local_d8 * local_f8->elemsize +
                              (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                    local_a0 = *local_100;
                    if (0 < (int)pOVar30) {
                      iVar23 = 0;
                      do {
                        local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar23);
                        uVar26 = uVar28;
                        if (0 < (int)uVar44) {
                          do {
                            local_c0 = *pafVar46;
                            BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                      (&local_119,&local_a0,&local_c0);
                            *pafVar33 = local_c0;
                            pafVar46 = pafVar46 + 1;
                            pafVar33 = pafVar33 + 1;
                            uVar54 = (int)uVar26 - 1;
                            uVar26 = (ulong)uVar54;
                          } while (uVar54 != 0);
                        }
                        iVar23 = (uint)local_110 + 1;
                        pOVar30 = local_118;
                      } while (iVar23 != (int)local_118);
                    }
                    local_100 = local_100 + 1;
                    iVar23 = (int)local_e8 + 1;
                  } while (iVar23 != (int)local_108);
                }
                local_d8 = local_d8 + 1;
              } while (local_d8 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        local_e8 = pMVar25;
        local_e0 = this_00;
        Mat::create(this_00,uVar54,uVar43,local_c8,iVar23,pAVar8);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_f8[1].dims == 1) {
          Mat::create(this_00,(int)local_100,(int)local_110,local_c8,iVar23,opt->blob_allocator);
          puVar36 = (undefined8 *)this_00->data;
          if (puVar36 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar24 != 1 || local_f8[1].w != 1) {
            if (0 < (int)(uint)local_110) {
              pafVar46 = (__m256 *)local_f8->data;
              local_128 = (__m256 *)local_f8[1].data;
              local_118 = (Option *)((ulong)local_118 & 0xffffffff00000000);
              do {
                local_a0 = *local_128;
                uVar28 = (ulong)local_100 & 0xffffffff;
                if (0 < (int)local_100) {
                  do {
                    uVar90 = *(undefined8 *)*pafVar46;
                    uVar89 = *(undefined8 *)(*pafVar46 + 2);
                    uVar92 = *(undefined8 *)(*pafVar46 + 4);
                    uVar93 = *(undefined8 *)(*pafVar46 + 6);
                    local_c0 = *pafVar46;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              (&local_119,&local_c0,&local_a0);
                    *puVar36 = uVar90;
                    puVar36[1] = uVar89;
                    puVar36[2] = uVar92;
                    puVar36[3] = uVar93;
                    pafVar46 = pafVar46 + 1;
                    puVar36 = puVar36 + 4;
                    uVar54 = (int)uVar28 - 1;
                    uVar28 = (ulong)uVar54;
                  } while (uVar54 != 0);
                }
                local_128 = local_128 + 1;
                iVar23 = (int)local_118 + 1;
                local_118 = (Option *)CONCAT44(local_118._4_4_,iVar23);
              } while (iVar23 != (uint)local_110);
              return 0;
            }
            return 0;
          }
LAB_00416add:
          iVar23 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                             (local_f8,pMVar25,this_00,opt);
          return iVar23;
        }
        a = local_f8;
        if (local_f8[1].dims != 2) {
          return 0;
        }
LAB_0040e292:
        iVar23 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                           (a,pMVar25,this_00,opt);
        return iVar23;
      case 3:
        if (a[1].dims == 3) {
          if (uVar6 == uVar42 && (uVar4 == 1 && uVar44 == 1)) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar54,uVar43,uVar42,local_c8,iVar23,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_d0) {
                local_110 = (__m256 *)0x0;
                do {
                  pvVar53 = local_f8->data;
                  local_a0 = *(__m256 *)
                              ((long)local_f8[1].data +
                              local_f8[1].cstep * (long)local_110 * local_f8[1].elemsize);
                  if (0 < (int)local_d8) {
                    local_118 = (Option *)
                                ((long)local_e0->data +
                                local_e0->cstep * local_e0->elemsize * (long)local_110);
                    lVar29 = local_f8->cstep * local_f8->elemsize * (long)local_110;
                    lVar52 = 0;
                    iVar23 = (int)local_d8;
                    do {
                      pafVar46 = (__m256 *)((long)pvVar53 + lVar52 + lVar29);
                      uVar90 = *(undefined8 *)*pafVar46;
                      uVar89 = *(undefined8 *)(*pafVar46 + 2);
                      uVar92 = *(undefined8 *)(*pafVar46 + 4);
                      uVar93 = *(undefined8 *)(*pafVar46 + 6);
                      local_c0 = *pafVar46;
                      BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                (&local_119,&local_c0,&local_a0);
                      puVar36 = (undefined8 *)((long)local_118 + lVar52);
                      *puVar36 = uVar90;
                      puVar36[1] = uVar89;
                      puVar36[2] = uVar92;
                      puVar36[3] = uVar93;
                      lVar52 = lVar52 + 0x20;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 1);
                } while (local_110 != (__m256 *)local_d0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_108 = CONCAT44(local_108._4_4_,uVar44) ^ 1;
          if ((uVar44 == uVar54) && (iVar24 == 1 && (uVar6 == 1 && uVar4 == uVar43))) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar54,uVar43,uVar42,local_c8,iVar23,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_d0) {
                local_100 = (__m256 *)0x0;
                do {
                  if (0 < (int)local_d8) {
                    lVar29 = local_e0->cstep * local_e0->elemsize * (long)local_100;
                    pvVar53 = local_e0->data;
                    local_110 = (__m256 *)local_f8[1].data;
                    local_118 = (Option *)
                                (local_f8->cstep * local_f8->elemsize * (long)local_100 +
                                (long)local_f8->data);
                    lVar52 = 0;
                    iVar23 = (int)local_d8;
                    do {
                      local_a0 = *(__m256 *)((long)local_118 + lVar52 * 8);
                      fVar2 = *(float *)((long)local_110 + lVar52);
                      local_c0[1] = fVar2;
                      local_c0[0] = fVar2;
                      local_c0[2] = fVar2;
                      local_c0[3] = fVar2;
                      local_c0[4] = fVar2;
                      local_c0[5] = fVar2;
                      local_c0[6] = fVar2;
                      local_c0[7] = fVar2;
                      BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                (&local_119,&local_a0,&local_c0);
                      *(__m256 *)((long)pvVar53 + lVar52 * 8 + lVar29) = local_c0;
                      lVar52 = lVar52 + 4;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_100 = (__m256 *)((long)local_100 + 1);
                } while (local_100 != (__m256 *)local_d0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar43 == 1 && (uVar54 ^ 1) == 0) && uVar42 == uVar6) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar44,uVar4,uVar6,sVar27,iVar24,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_110 = (__m256 *)0x0;
                do {
                  pvVar53 = local_f8[1].data;
                  local_a0 = *(__m256 *)
                              ((long)local_f8->data +
                              local_f8->cstep * (long)local_110 * local_f8->elemsize);
                  if (0 < (int)local_60) {
                    local_118 = (Option *)
                                ((long)local_e0->data +
                                local_e0->cstep * local_e0->elemsize * (long)local_110);
                    lVar29 = local_f8[1].cstep * local_f8[1].elemsize * (long)local_110;
                    lVar52 = 0;
                    iVar23 = (int)local_60;
                    do {
                      pafVar46 = (__m256 *)((long)pvVar53 + lVar52 + lVar29);
                      uVar90 = *(undefined8 *)*pafVar46;
                      uVar89 = *(undefined8 *)(*pafVar46 + 2);
                      uVar92 = *(undefined8 *)(*pafVar46 + 4);
                      uVar93 = *(undefined8 *)(*pafVar46 + 6);
                      local_c0 = *pafVar46;
                      BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                (&local_119,&local_a0,&local_c0);
                      puVar36 = (undefined8 *)((long)local_118 + lVar52);
                      *puVar36 = uVar90;
                      puVar36[1] = uVar89;
                      puVar36[2] = uVar92;
                      puVar36[3] = uVar93;
                      lVar52 = lVar52 + 0x20;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_110 = (__m256 *)((long)local_110 + 1);
                } while (local_110 != (__m256 *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar44 == uVar54) && (iVar23 == 1)) && (uVar4 == uVar43)) && (uVar42 == 1)) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar44,uVar4,uVar6,sVar27,iVar24,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_100 = (__m256 *)0x0;
                do {
                  if (0 < (int)local_60) {
                    local_118 = (Option *)local_f8->data;
                    lVar29 = local_e0->cstep * local_e0->elemsize * (long)local_100;
                    pvVar53 = local_e0->data;
                    local_110 = (__m256 *)
                                (local_f8[1].cstep * local_f8[1].elemsize * (long)local_100 +
                                (long)local_f8[1].data);
                    lVar52 = 0;
                    iVar23 = (int)local_60;
                    do {
                      local_a0[1] = *(float *)((long)local_118 + lVar52);
                      local_a0[0] = local_a0[1];
                      local_a0[2] = local_a0[1];
                      local_a0[3] = local_a0[1];
                      local_a0[4] = local_a0[1];
                      local_a0[5] = local_a0[1];
                      local_a0[6] = local_a0[1];
                      local_a0[7] = local_a0[1];
                      local_c0 = *(__m256 *)((long)local_110 + lVar52 * 8);
                      BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                (&local_119,&local_a0,&local_c0);
                      *(__m256 *)((long)pvVar53 + lVar52 * 8 + lVar29) = local_c0;
                      lVar52 = lVar52 + 4;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  local_100 = (__m256 *)((long)local_100 + 1);
                } while (local_100 != (__m256 *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((int)local_108 == 0 && uVar4 == uVar43) && uVar42 == uVar6) && uVar54 != 1) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar54,uVar43,uVar42,local_c8,iVar23,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_108 = 0;
                do {
                  if (0 < (int)(uint)local_110) {
                    local_118 = (Option *)
                                (local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                                (long)local_f8[1].data);
                    pafVar46 = (__m256 *)
                               (local_e0->cstep * local_108 * local_e0->elemsize +
                               (long)local_e0->data);
                    pafVar33 = (__m256 *)
                               (local_f8->cstep * local_108 * local_f8->elemsize +
                               (long)local_f8->data);
                    uVar28 = 0;
                    do {
                      local_a0 = *(__m256 *)((long)local_118 + uVar28 * 0x20);
                      uVar26 = (ulong)local_100 & 0xffffffff;
                      if (0 < (int)local_100) {
                        do {
                          local_c0 = *pafVar33;
                          BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                    (&local_119,&local_c0,&local_a0);
                          *pafVar46 = local_c0;
                          pafVar33 = pafVar33 + 1;
                          pafVar46 = pafVar46 + 1;
                          uVar54 = (int)uVar26 - 1;
                          uVar26 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      uVar28 = uVar28 + 1;
                    } while ((__m256 *)uVar28 != local_110);
                  }
                  local_108 = local_108 + 1;
                } while (local_108 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar4 == 1 && (uVar44 ^ uVar54) == 0) && uVar6 == uVar42) && uVar43 != 1) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar54,uVar43,uVar42,local_c8,iVar23,opt->blob_allocator);
            if (local_e0->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                lVar29 = (long)local_100 << 5;
                local_108 = 0;
                local_118 = (Option *)lVar29;
                do {
                  if (0 < (int)local_110) {
                    pvVar35 = (void *)(local_e0->cstep * local_108 * local_e0->elemsize +
                                      (long)local_e0->data);
                    pvVar55 = (void *)(local_f8->cstep * local_108 * local_f8->elemsize +
                                      (long)local_f8->data);
                    lVar52 = local_f8[1].elemsize * local_f8[1].cstep * local_108;
                    pvVar53 = local_f8[1].data;
                    iVar23 = 0;
                    pafVar46 = local_110;
                    do {
                      if (0 < (int)local_100) {
                        lVar47 = 0;
                        do {
                          local_a0 = *(__m256 *)((long)pvVar55 + lVar47);
                          local_c0 = *(__m256 *)((long)pvVar53 + lVar47 + lVar52);
                          BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                    (&local_119,&local_a0,&local_c0);
                          *(__m256 *)((long)pvVar35 + lVar47) = local_c0;
                          lVar47 = lVar47 + 0x20;
                        } while (lVar29 != lVar47);
                        pvVar35 = (void *)((long)pvVar35 + lVar47);
                        pvVar55 = (void *)((long)pvVar55 + lVar47);
                        pafVar46 = local_110;
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != (int)pafVar46);
                  }
                  local_108 = local_108 + 1;
                } while (local_108 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar54 ^ 1) == 0 && uVar43 == uVar4) && uVar6 == uVar42) && uVar44 != 1) {
            local_f8 = a;
            local_e8 = pMVar25;
            local_e0 = this_00;
            local_d0 = uVar26;
            Mat::create(this_00,uVar44,uVar4,uVar6,sVar27,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_108 = 0;
                pOVar30 = local_118;
                do {
                  if (0 < (int)pOVar30) {
                    local_100 = (__m256 *)
                                (local_f8->cstep * local_108 * local_f8->elemsize +
                                (long)local_f8->data);
                    pafVar33 = (__m256 *)
                               (local_e0->cstep * local_108 * local_e0->elemsize +
                               (long)local_e0->data);
                    pafVar46 = (__m256 *)
                               (local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                               (long)local_f8[1].data);
                    local_110 = (__m256 *)0x0;
                    do {
                      local_a0 = *(__m256 *)((long)local_100 + (long)local_110 * 0x20);
                      uVar26 = uVar28;
                      if (0 < (int)uVar44) {
                        do {
                          local_c0 = *pafVar46;
                          BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                    (&local_119,&local_a0,&local_c0);
                          *pafVar33 = local_c0;
                          pafVar46 = pafVar46 + 1;
                          pafVar33 = pafVar33 + 1;
                          uVar54 = (int)uVar26 - 1;
                          uVar26 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      local_110 = (__m256 *)((long)local_110 + 1);
                      pOVar30 = local_118;
                    } while ((Option *)local_110 != local_118);
                  }
                  local_108 = local_108 + 1;
                } while (local_108 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          local_d0 = uVar26;
          if ((((uVar44 ^ uVar54) == 0 && uVar43 == 1) && uVar42 == uVar6) && uVar4 != 1) {
            Mat::create(this_00,uVar44,uVar4,uVar6,sVar27,iVar24,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_e0->c * local_e0->cstep != 0) {
              if (0 < (int)local_f0) {
                local_108 = 0;
                pOVar30 = local_118;
                local_100 = (__m256 *)(uVar28 << 5);
                do {
                  if (0 < (int)pOVar30) {
                    pvVar55 = (void *)(local_e0->cstep * local_108 * local_e0->elemsize +
                                      (long)local_e0->data);
                    pvVar35 = (void *)(local_f8[1].cstep * local_108 * local_f8[1].elemsize +
                                      (long)local_f8[1].data);
                    lVar29 = local_f8->elemsize * local_f8->cstep * local_108;
                    pvVar53 = local_f8->data;
                    iVar23 = 0;
                    do {
                      if (0 < (int)uVar44) {
                        local_110 = (__m256 *)CONCAT44(local_110._4_4_,iVar23);
                        lVar52 = 0;
                        do {
                          local_a0 = *(__m256 *)((long)pvVar53 + lVar52 + lVar29);
                          local_c0 = *(__m256 *)((long)pvVar35 + lVar52);
                          BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                    (&local_119,&local_a0,&local_c0);
                          *(__m256 *)((long)pvVar55 + lVar52) = local_c0;
                          lVar52 = lVar52 + 0x20;
                        } while (uVar28 << 5 != lVar52);
                        pvVar55 = (void *)((long)pvVar55 + lVar52);
                        pvVar35 = (void *)((long)pvVar35 + lVar52);
                        pOVar30 = local_118;
                        iVar23 = (uint)local_110;
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != (int)pOVar30);
                  }
                  local_108 = local_108 + 1;
                } while (local_108 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          goto LAB_0040e292;
        }
        if (a[1].dims == 4) {
          local_f8 = a;
          local_e8 = pMVar25;
          local_e0 = this_00;
          local_d0 = uVar26;
          Mat::create(this_00,uVar44,uVar4,iVar5,uVar6,sVar27,iVar24,opt->blob_allocator);
          if (local_e0->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_e0->c * local_e0->cstep != 0) {
            if (0 < (int)local_f0) {
              local_d8 = 0;
              pOVar30 = local_118;
              do {
                if (0 < (int)local_108) {
                  pafVar33 = (__m256 *)
                             (local_e0->cstep * local_d8 * local_e0->elemsize + (long)local_e0->data
                             );
                  pafVar46 = (__m256 *)
                             (local_f8[1].cstep * local_d8 * local_f8[1].elemsize +
                             (long)local_f8[1].data);
                  local_110 = (__m256 *)
                              (local_f8->cstep * local_d8 * local_f8->elemsize +
                              (long)local_f8->data);
                  iVar23 = 0;
                  do {
                    local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                    if (0 < (int)pOVar30) {
                      iVar23 = 0;
                      do {
                        local_100 = (__m256 *)CONCAT44(local_100._4_4_,iVar23);
                        local_a0 = *local_110;
                        uVar26 = uVar28;
                        if (0 < (int)uVar44) {
                          do {
                            local_c0 = *pafVar46;
                            BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                      (&local_119,&local_a0,&local_c0);
                            *pafVar33 = local_c0;
                            pafVar46 = pafVar46 + 1;
                            pafVar33 = pafVar33 + 1;
                            uVar54 = (int)uVar26 - 1;
                            uVar26 = (ulong)uVar54;
                          } while (uVar54 != 0);
                        }
                        local_110 = local_110 + 1;
                        iVar23 = (int)local_100 + 1;
                        pOVar30 = local_118;
                      } while (iVar23 != (int)local_118);
                    }
                    iVar23 = (int)local_e8 + 1;
                  } while (iVar23 != (int)local_108);
                }
                local_d8 = local_d8 + 1;
              } while (local_d8 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_f8 = a;
        local_e8 = pMVar25;
        local_e0 = this_00;
        local_d0 = uVar26;
        Mat::create(this_00,uVar54,uVar43,uVar42,local_c8,iVar23,opt->blob_allocator);
        if (local_e0->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_e0->c * local_e0->cstep == 0) {
          return -100;
        }
        if (local_f8[1].dims == 1) {
          this_00 = local_e0;
          if (iVar24 != 1 || local_f8[1].w != 1) {
            if (0 < (int)local_d0) {
              local_110 = (__m256 *)0x0;
              do {
                pvVar53 = local_f8->data;
                local_a0 = *(__m256 *)((long)local_f8[1].data + (long)local_110 * 0x20);
                if (0 < (int)local_d8) {
                  local_118 = (Option *)
                              (local_e0->cstep * local_e0->elemsize * (long)local_110 +
                              (long)local_e0->data);
                  lVar29 = local_f8->cstep * local_f8->elemsize * (long)local_110;
                  lVar52 = 0;
                  iVar23 = (int)local_d8;
                  do {
                    pafVar46 = (__m256 *)((long)pvVar53 + lVar52 + lVar29);
                    uVar90 = *(undefined8 *)*pafVar46;
                    uVar89 = *(undefined8 *)(*pafVar46 + 2);
                    uVar92 = *(undefined8 *)(*pafVar46 + 4);
                    uVar93 = *(undefined8 *)(*pafVar46 + 6);
                    local_c0 = *pafVar46;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              (&local_119,&local_c0,&local_a0);
                    puVar36 = (undefined8 *)((long)local_118 + lVar52);
                    *puVar36 = uVar90;
                    puVar36[1] = uVar89;
                    puVar36[2] = uVar92;
                    puVar36[3] = uVar93;
                    lVar52 = lVar52 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                local_110 = (__m256 *)((long)local_110 + 1);
              } while (local_110 != (__m256 *)local_d0);
              return 0;
            }
            return 0;
          }
          goto LAB_00416add;
        }
        if (local_f8[1].dims == 2) {
          if (0 < (int)local_d0) {
            local_108 = 0;
            do {
              if (0 < (int)(uint)local_110) {
                pafVar48 = (__m256 *)
                           (local_e0->cstep * local_108 * local_e0->elemsize + (long)local_e0->data)
                ;
                pafVar46 = (__m256 *)
                           ((long)local_f8[1].w * local_108 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pafVar33 = (__m256 *)
                           (local_f8->cstep * local_108 * local_f8->elemsize + (long)local_f8->data)
                ;
                iVar23 = 0;
                do {
                  local_118 = (Option *)CONCAT44(local_118._4_4_,iVar23);
                  local_a0 = *pafVar46;
                  uVar28 = (ulong)local_100 & 0xffffffff;
                  if (0 < (int)local_100) {
                    do {
                      local_c0 = *pafVar33;
                      BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                (&local_119,&local_c0,&local_a0);
                      *pafVar48 = local_c0;
                      pafVar33 = pafVar33 + 1;
                      pafVar48 = pafVar48 + 1;
                      uVar54 = (int)uVar28 - 1;
                      uVar28 = (ulong)uVar54;
                    } while (uVar54 != 0);
                  }
                  pafVar46 = pafVar46 + 1;
                  iVar23 = (int)local_118 + 1;
                } while (iVar23 != (uint)local_110);
              }
              local_108 = local_108 + 1;
            } while (local_108 != local_d0);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        local_e8 = pMVar25;
        local_e0 = this_00;
        if (a[1].dims == 4) goto LAB_0040e292;
        local_108 = CONCAT44(local_108._4_4_,iVar3);
        local_f8 = a;
        Mat::create(this_00,uVar54,uVar43,iVar3,uVar42,local_c8,iVar23,opt->blob_allocator);
        if (local_e0->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_e0->c * local_e0->cstep == 0) {
          return -100;
        }
        iVar23 = local_f8[1].dims;
        if (iVar23 == 1) {
          this_00 = local_e0;
          pMVar25 = local_e8;
          local_d0 = uVar26;
          if (iVar24 != 1 || local_f8[1].w != 1) {
            if (0 < (int)uVar42) {
              local_110 = (__m256 *)0x0;
              do {
                pvVar53 = local_f8->data;
                local_a0 = *(__m256 *)((long)local_f8[1].data + (long)local_110 * 0x20);
                if (0 < (int)local_d8) {
                  lVar29 = local_f8->cstep * local_f8->elemsize * (long)local_110;
                  local_118 = (Option *)
                              (local_e0->cstep * local_e0->elemsize * (long)local_110 +
                              (long)local_e0->data);
                  lVar52 = 0;
                  iVar23 = (int)local_d8;
                  do {
                    pafVar46 = (__m256 *)((long)pvVar53 + lVar52 + lVar29);
                    uVar90 = *(undefined8 *)*pafVar46;
                    uVar89 = *(undefined8 *)(*pafVar46 + 2);
                    uVar92 = *(undefined8 *)(*pafVar46 + 4);
                    uVar93 = *(undefined8 *)(*pafVar46 + 6);
                    local_c0 = *pafVar46;
                    BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                              (&local_119,&local_c0,&local_a0);
                    puVar36 = (undefined8 *)((long)local_118 + lVar52);
                    *puVar36 = uVar90;
                    puVar36[1] = uVar89;
                    puVar36[2] = uVar92;
                    puVar36[3] = uVar93;
                    lVar52 = lVar52 + 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                local_110 = (__m256 *)((long)local_110 + 1);
              } while (local_110 != (__m256 *)local_d0);
              return 0;
            }
            return 0;
          }
          goto LAB_00416add;
        }
        if (iVar23 == 3) {
          if (0 < (int)uVar42) {
            local_f0 = 0;
            local_d0 = uVar26;
            do {
              if (0 < (int)local_108) {
                pafVar33 = (__m256 *)
                           (local_e0->cstep * local_f0 * local_e0->elemsize + (long)local_e0->data);
                pafVar48 = (__m256 *)
                           (local_f8[1].cstep * local_f0 * local_f8[1].elemsize +
                           (long)local_f8[1].data);
                pafVar49 = (__m256 *)
                           (local_f8->cstep * local_f0 * local_f8->elemsize + (long)local_f8->data);
                iVar23 = 0;
                pafVar46 = local_110;
                do {
                  local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                  if (0 < (int)pafVar46) {
                    iVar23 = 0;
                    do {
                      local_118 = (Option *)CONCAT44(local_118._4_4_,iVar23);
                      local_a0 = *pafVar48;
                      uVar28 = (ulong)local_100 & 0xffffffff;
                      if (0 < (int)local_100) {
                        do {
                          local_c0 = *pafVar49;
                          BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                    (&local_119,&local_c0,&local_a0);
                          *pafVar33 = local_c0;
                          pafVar49 = pafVar49 + 1;
                          pafVar33 = pafVar33 + 1;
                          uVar54 = (int)uVar28 - 1;
                          uVar28 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      pafVar48 = pafVar48 + 1;
                      iVar23 = (int)local_118 + 1;
                      pafVar46 = local_110;
                    } while (iVar23 != (int)local_110);
                  }
                  iVar23 = (int)local_e8 + 1;
                } while (iVar23 != (int)local_108);
              }
              local_f0 = local_f0 + 1;
            } while (local_f0 != local_d0);
            return 0;
          }
          return 0;
        }
        if (iVar23 == 2) {
          if (0 < (int)uVar42) {
            local_f0 = 0;
            local_d0 = uVar26;
            do {
              if (0 < (int)local_108) {
                pafVar33 = (__m256 *)
                           (local_e0->cstep * local_f0 * local_e0->elemsize + (long)local_e0->data);
                local_118 = (Option *)
                            ((long)local_f8[1].w * local_f0 * local_f8[1].elemsize +
                            (long)local_f8[1].data);
                pafVar48 = (__m256 *)
                           (local_f8->cstep * local_f0 * local_f8->elemsize + (long)local_f8->data);
                iVar23 = 0;
                pafVar46 = local_110;
                do {
                  local_e8 = (Mat *)CONCAT44(local_e8._4_4_,iVar23);
                  local_a0 = *(__m256 *)local_118;
                  if (0 < (int)pafVar46) {
                    iVar23 = 0;
                    do {
                      uVar28 = (ulong)local_100 & 0xffffffff;
                      if (0 < (int)local_100) {
                        do {
                          local_c0 = *pafVar48;
                          BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                                    (&local_119,&local_c0,&local_a0);
                          *pafVar33 = local_c0;
                          pafVar48 = pafVar48 + 1;
                          pafVar33 = pafVar33 + 1;
                          uVar54 = (int)uVar28 - 1;
                          uVar28 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      iVar23 = iVar23 + 1;
                      pafVar46 = local_110;
                    } while (iVar23 != (int)local_110);
                  }
                  local_118 = (Option *)((long)local_118 + 0x20);
                  iVar23 = (int)local_e8 + 1;
                } while (iVar23 != (int)local_108);
              }
              local_f0 = local_f0 + 1;
            } while (local_f0 != local_d0);
            return 0;
          }
          return 0;
        }
      }
    }
    return 0;
  case 7:
    pMVar37 = a;
    a = pMVar25;
    break;
  case 8:
    pMVar37 = a;
    a = pMVar25;
LAB_0040d478:
    iVar23 = binary_op_pack8<ncnn::BinaryOp_x86_avx_functor::binary_op_div>(a,pMVar37,this_00,opt);
    return iVar23;
  default:
    goto switchD_0040cf7c_default;
  }
  iVar23 = binary_op_pack8<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>(a,pMVar37,this_00,opt);
  return iVar23;
switchD_0040d334_caseD_1:
  Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if ((uint)local_110 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_min>(a,pMVar25,this_00,local_118)
    ;
    return 0;
  }
  goto LAB_004180c2;
switchD_0040f35e_caseD_1:
  Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if ((uint)local_110 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_max>(a,pMVar25,this_00,local_118)
    ;
    return 0;
  }
  goto LAB_00417d91;
switchD_0040f526_caseD_1:
  Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if ((uint)local_110 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>(a,pMVar25,this_00,local_118)
    ;
    return 0;
  }
  goto LAB_00417f23;
switchD_0040f6ee_caseD_1:
  Mat::create(this_00,uVar54,sVar27,iVar23,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if ((uint)local_110 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_add>(a,pMVar25,this_00,local_118)
    ;
    return 0;
  }
  goto LAB_00418026;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_avx_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}